

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  undefined3 uVar7;
  bool reduce_c;
  int i;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined8 in_RAX;
  int *piVar11;
  Mat *pMVar12;
  undefined4 uVar13;
  int iVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  uint uVar18;
  Mat *pMVar19;
  Mat *pMVar20;
  byte bVar21;
  uint uVar22;
  long lVar23;
  undefined1 post_process;
  bool post_process_00;
  byte bVar24;
  Mat *pMVar25;
  void *pvVar26;
  Mat *pMVar27;
  ulong uVar28;
  Mat *pMVar29;
  ulong uVar30;
  void *pvVar31;
  void *pvVar32;
  Mat *pMVar33;
  float extraout_XMM0_Da;
  float fVar34;
  float extraout_XMM0_Da_00;
  float fVar35;
  undefined1 in_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_var [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 extraout_XMM0_12 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_var_03 [12];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_var_04 [12];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  int iVar202;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  Option *in_stack_ffffffffffffff20;
  Mat *local_d8;
  Mat *local_c0;
  void *local_b8;
  void *local_a8;
  void *ptr;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  int iStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Mat *local_58;
  Mat *local_50;
  size_t local_48;
  int axes_flag [3];
  
  uVar10 = bottom_blob->dims;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  if (this->reduce_all == 0) {
    iVar14 = (this->axes).w;
    if (0 < (long)iVar14) {
      pvVar31 = (this->axes).data;
      lVar23 = 0;
      do {
        iVar8 = *(int *)((long)pvVar31 + lVar23 * 4);
        axes_flag[(int)(iVar8 + (iVar8 >> 0x1f & uVar10 + 1) + -1)] = 1;
        lVar23 = lVar23 + 1;
      } while (iVar14 != lVar23);
    }
    auVar107 = _DAT_0016e010;
    if (uVar10 != 1) {
      if (uVar10 == 2) {
        in_XMM0._4_4_ = axes_flag[1];
        in_XMM0._0_4_ = (float)axes_flag[0];
        in_XMM0._8_8_ = 0;
        auVar107._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar107._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar107._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar107._12_4_ = 0xffffffff;
      }
      else {
        if (uVar10 == 3) {
          uVar13 = (undefined4)CONCAT71((int7)(int3)((uint)iVar14 >> 8),axes_flag[0] == 1);
          in_XMM0._4_4_ = axes_flag[2];
          in_XMM0._0_4_ = (float)axes_flag[1];
          in_XMM0._8_8_ = 0;
          auVar107._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar107._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar107._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar107._12_4_ = 0xffffffff;
          goto LAB_00137294;
        }
        auVar107 = (undefined1  [16])0x0;
      }
    }
    uVar13 = 0;
  }
  else {
    uVar13 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    auVar107 = _DAT_0016f3e0;
  }
LAB_00137294:
  lVar23 = auVar107._0_8_;
  lVar17 = auVar107._8_8_;
  reduce_c = SUB41(uVar13,0);
  fVar34 = in_XMM0._0_4_;
  bVar15 = auVar107[0];
  bVar16 = auVar107[8];
  uVar7 = auVar107._1_3_;
  pMVar19 = (Mat *)&switchD_001372b2::switchdataD_0016f400;
  switch(this->operation) {
  case 0:
    fVar34 = this->coeff;
    iVar14 = this->keepdims;
    auVar108._0_8_ = lVar23 << 0x3f;
    auVar108._8_8_ = lVar17 << 0x3f;
    uVar13 = movmskpd(uVar10,auVar108);
    bVar16 = (byte)uVar13;
    post_process_00 = false;
    goto LAB_001379c7;
  case 1:
    fVar34 = this->coeff;
    post_process = (undefined1)this->keepdims;
    auVar112._0_8_ = lVar23 << 0x3f;
    auVar112._8_8_ = lVar17 << 0x3f;
    uVar13 = movmskpd(uVar10,auVar112);
    bVar16 = (byte)uVar13;
    goto LAB_0013746e;
  case 2:
    fVar34 = this->coeff;
    pMVar19 = top_blob;
    if (this->keepdims == 0) {
      auVar115._0_8_ = lVar23 << 0x3f;
      auVar115._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar115);
      iVar14 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    else {
      auVar110._0_8_ = lVar23 << 0x3f;
      auVar110._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar110);
      iVar14 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
joined_r0x0013ea1c:
    if (iVar14 != 0) {
      return -100;
    }
    break;
  case 3:
    if (uVar10 == 3) {
      auVar37._0_8_ = lVar23 << 0x3f;
      auVar37._8_8_ = lVar17 << 0x3f;
      uVar9 = movmskpd(0x16f400,auVar37);
      iVar14 = 1;
      uVar10 = 1;
      if ((uVar9 & 2) != 0) {
        uVar10 = bottom_blob->w;
      }
      if ((uVar9 & 1) != 0) {
        iVar14 = bottom_blob->h;
      }
      iVar14 = iVar14 * uVar10;
      if (reduce_c != false) {
        iVar14 = iVar14 * bottom_blob->c;
      }
    }
    else if (uVar10 == 2) {
      auVar36._0_8_ = lVar23 << 0x3f;
      auVar36._8_8_ = lVar17 << 0x3f;
      uVar10 = movmskpd(2,auVar36);
      iVar14 = 1;
      if ((uVar10 & 2) != 0) {
        iVar14 = bottom_blob->w;
      }
      if ((uVar10 & 1) != 0) {
        iVar14 = iVar14 * bottom_blob->h;
      }
    }
    else {
      iVar14 = 1;
      if (uVar10 == 1) {
        iVar14 = bottom_blob->w;
      }
    }
    fVar34 = this->coeff / (float)iVar14;
    iVar14 = this->keepdims;
    auVar117._0_8_ = lVar23 << 0x3f;
    auVar117._8_8_ = lVar17 << 0x3f;
    uVar13 = movmskpd(uVar10,auVar117);
    bVar16 = (byte)uVar13;
    post_process_00 = true;
LAB_001379c7:
    iVar14 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar34,(bool)(bVar16 >> 1),(bool)(bVar16 & 1),reduce_c,
                        post_process_00,0.0,iVar14,opt);
    return iVar14;
  case 4:
    fVar34 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar10 == 3) {
        uVar10 = bottom_blob->w;
        lVar23 = (long)(int)uVar10;
        uVar9 = bottom_blob->h;
        uVar28 = (ulong)uVar9;
        uVar22 = bottom_blob->c;
        pMVar20 = (Mat *)(long)(int)uVar22;
        uVar18 = uVar9 * uVar10;
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar61._0_8_ = SUB168(auVar60 ^ auVar107,0) << 0x3f;
        auVar61._8_8_ = SUB168(auVar60 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(3,auVar61);
        bVar24 = reduce_c ^ 1;
        if (iVar14 == 0 && bVar24 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar22 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
          pMVar25 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar25;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar22 < 1) {
            fVar35 = -3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar31 = bottom_blob->data;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = -3.4028235e+38;
              if (0 < (int)uVar18) {
                uVar30 = 0;
                fVar35 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + uVar30 * 4);
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar19 != pMVar20);
            fVar35 = -3.4028235e+38;
            pMVar25 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              if (fVar35 <= fVar1) {
                fVar35 = fVar1;
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d38d;
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
        else if (iVar14 == 0 && reduce_c == false) {
          pMVar19 = (Mat *)(ulong)uVar22;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)(ulong)uVar18;
            pMVar25 = (Mat *)0x0;
            do {
              fVar35 = -3.4028235e+38;
              if (0 < (int)uVar18) {
                pMVar12 = (Mat *)0x0;
                fVar35 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar19 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar25 * 4) = fVar35;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar25 != pMVar20);
          }
        }
        else {
          pMVar25 = (Mat *)(ulong)uVar10;
          bVar21 = (byte)iVar14 >> 1 | bVar15;
          if (reduce_c != false || (bVar21 & 1) != 0) {
            if ((bVar21 & 1) == 0 && bVar24 == 0) {
              Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar9,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar83._8_4_ = (int)lVar17;
                    auVar83._0_8_ = lVar17;
                    auVar83._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar83 = auVar83 ^ _DAT_0016e020;
                    do {
                      auVar166._8_4_ = (int)pMVar19;
                      auVar166._0_8_ = pMVar19;
                      auVar166._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar166 | auVar107) ^ auVar76;
                      iVar14 = auVar83._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar83._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != auVar83._12_4_ || auVar205._8_4_ <= auVar83._8_4_) &&
                          auVar205._12_4_ <= auVar83._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar166 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar83._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0xff7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        pvVar26 = pvVar31;
                        do {
                          auVar127 = ZEXT816(0xff7fffff);
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            auVar127 = ZEXT816(0xff7fffff);
                            do {
                              fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              if (auVar127._0_4_ <= fVar35) {
                                auVar127._0_4_ = fVar35;
                              }
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          *(int *)((long)ptr +
                                  uVar30 * 4 +
                                  CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                               auVar127._0_4_;
                          uVar30 = uVar30 + 1;
                          pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                        } while (uVar30 != uVar28);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar84._8_4_ = (int)lVar23;
                    auVar84._0_8_ = lVar23;
                    auVar84._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar30 = 0;
                    auVar84 = auVar84 ^ _DAT_0016e020;
                    do {
                      auVar167._8_4_ = (int)uVar30;
                      auVar167._0_8_ = uVar30;
                      auVar167._12_4_ = (int)(uVar30 >> 0x20);
                      auVar205 = (auVar167 | auVar107) ^ auVar76;
                      iVar14 = auVar84._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar84._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)&pMVar19->data + uVar30 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != auVar84._12_4_ || auVar205._8_4_ <= auVar84._8_4_) &&
                          auVar205._12_4_ <= auVar84._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar167 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar84._0_4_)) {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0xff7fffff;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0xff7fffff;
                      }
                      uVar30 = uVar30 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar26 + uVar30 * 4);
                          fVar35 = *(float *)((long)pvVar31 + uVar30 * 4);
                          if (fVar1 <= fVar35) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar31 + uVar30 * 4) = fVar1;
                          uVar30 = uVar30 + 1;
                        } while (uVar28 != uVar30);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            else {
              bVar21 = (byte)iVar14 | bVar16;
              if ((bVar21 & 1) != 0 || bVar24 != 0) {
                if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                  Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar104._8_4_ = (int)lVar23;
                    auVar104._0_8_ = lVar23;
                    auVar104._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar104 = auVar104 ^ _DAT_0016e020;
                    do {
                      auVar193._8_4_ = (int)uVar28;
                      auVar193._0_8_ = uVar28;
                      auVar193._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar193 | auVar107) ^ auVar76;
                      iVar14 = auVar104._4_4_;
                      iVar8 = auVar104._12_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar104._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar104._8_4_) &&
                          auVar205._12_4_ <= iVar8) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar193 | auVar69) ^ auVar76;
                      auVar216._0_4_ = -(uint)(auVar104._0_4_ < auVar205._0_4_);
                      auVar216._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                      auVar216._8_4_ = -(uint)(auVar104._8_4_ < auVar205._8_4_);
                      auVar216._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                      iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                      iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                      auVar231._4_4_ = iVar14;
                      auVar231._0_4_ = iVar14;
                      auVar231._8_4_ = iVar8;
                      auVar231._12_4_ = iVar8;
                      auVar194._4_4_ = auVar216._4_4_;
                      auVar194._0_4_ = auVar216._4_4_;
                      auVar194._8_4_ = auVar216._12_4_;
                      auVar194._12_4_ = auVar216._12_4_;
                      auVar195._8_4_ = 0xffffffff;
                      auVar195._0_8_ = 0xffffffffffffffff;
                      auVar195._12_4_ = 0xffffffff;
                      auVar195 = (auVar194 | auVar231 & auVar216) ^ auVar195;
                      if ((auVar195 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar195._8_2_;
                      if ((auVar195 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                  }
                  pMVar19 = pMVar25;
                  if (0 < (int)uVar22) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar31 = bottom_blob->data;
                    pvVar26 = top_blob->data;
                    pMVar19 = (Mat *)(ulong)uVar18;
                    pMVar25 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar18) {
                        pMVar12 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                          fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                          if (fVar1 <= fVar35) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        } while (pMVar19 != pMVar12);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                    } while (pMVar25 != pMVar20);
                  }
                }
                else {
                  pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                  if (reduce_c == false && (bVar21 & 1) == 0) {
                    pMVar19 = (Mat *)(ulong)uVar10;
                    Mat::create(top_blob,uVar10,uVar22,sVar2,opt->blob_allocator);
                    auVar69 = _DAT_0016f1f0;
                    auVar76 = _DAT_0016e020;
                    auVar107 = _DAT_0016e010;
                    uVar18 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar18) {
                      pvVar31 = top_blob->data;
                      lVar23 = (ulong)uVar18 - 1;
                      auVar62._8_4_ = (int)lVar23;
                      auVar62._0_8_ = lVar23;
                      auVar62._12_4_ = (int)((ulong)lVar23 >> 0x20);
                      uVar28 = 0;
                      auVar62 = auVar62 ^ _DAT_0016e020;
                      do {
                        auVar145._8_4_ = (int)uVar28;
                        auVar145._0_8_ = uVar28;
                        auVar145._12_4_ = (int)(uVar28 >> 0x20);
                        auVar205 = (auVar145 | auVar107) ^ auVar76;
                        iVar14 = auVar62._4_4_;
                        iVar8 = auVar62._12_4_;
                        if ((bool)(~(auVar205._4_4_ == iVar14 && auVar62._0_4_ < auVar205._0_4_ ||
                                    iVar14 < auVar205._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0xff7fffff;
                        }
                        if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar62._8_4_) &&
                            auVar205._12_4_ <= iVar8) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0xff7fffff;
                        }
                        auVar205 = (auVar145 | auVar69) ^ auVar76;
                        auVar208._0_4_ = -(uint)(auVar62._0_4_ < auVar205._0_4_);
                        auVar208._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                        auVar208._8_4_ = -(uint)(auVar62._8_4_ < auVar205._8_4_);
                        auVar208._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                        iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                        iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                        auVar223._4_4_ = iVar14;
                        auVar223._0_4_ = iVar14;
                        auVar223._8_4_ = iVar8;
                        auVar223._12_4_ = iVar8;
                        auVar146._4_4_ = auVar208._4_4_;
                        auVar146._0_4_ = auVar208._4_4_;
                        auVar146._8_4_ = auVar208._12_4_;
                        auVar146._12_4_ = auVar208._12_4_;
                        auVar147._8_4_ = 0xffffffff;
                        auVar147._0_8_ = 0xffffffffffffffff;
                        auVar147._12_4_ = 0xffffffff;
                        auVar147 = (auVar146 | auVar223 & auVar208) ^ auVar147;
                        if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0xff7fffff;
                        }
                        pMVar19 = (Mat *)(ulong)auVar147._8_2_;
                        if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0xff7fffff;
                        }
                        uVar28 = uVar28 + 4;
                      } while ((uVar18 + 3 & 0xfffffffc) != uVar28);
                    }
                    if (0 < (int)uVar22) {
                      pvVar31 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar26 = top_blob->data;
                      pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                      sVar3 = bottom_blob->cstep;
                      pMVar12 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar9) {
                          uVar22 = 0;
                          pvVar32 = pvVar31;
                          do {
                            if (0 < (int)uVar10) {
                              pMVar33 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                                fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                                if (fVar1 <= fVar35) {
                                  fVar1 = fVar35;
                                }
                                *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                                pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                              } while (pMVar25 != pMVar33);
                            }
                            uVar22 = uVar22 + 1;
                            pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar10 * 4);
                          } while (uVar22 != uVar9);
                        }
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                        pvVar26 = (void *)((long)&pMVar19->data + (long)pvVar26);
                      } while (pMVar12 != pMVar20);
                    }
                  }
                }
                goto LAB_00138cf9;
              }
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)(ulong)uVar10;
              Mat::create((Mat *)&ptr,uVar10,1,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar95._8_4_ = (int)lVar17;
                    auVar95._0_8_ = lVar17;
                    auVar95._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar95 = auVar95 ^ _DAT_0016e020;
                    do {
                      auVar178._8_4_ = (int)pMVar19;
                      auVar178._0_8_ = pMVar19;
                      auVar178._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar178 | auVar107) ^ auVar76;
                      iVar14 = auVar95._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar95._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != auVar95._12_4_ || auVar205._8_4_ <= auVar95._8_4_) &&
                          auVar205._12_4_ <= auVar95._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar178 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar95._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0xff7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar18 = 0;
                        pvVar32 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                              fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              if (fVar1 <= fVar35) {
                                fVar1 = fVar35;
                              }
                              *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar18 = uVar18 + 1;
                          pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                        } while (uVar18 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                      pvVar26 = (void *)((long)pvVar26 +
                                        CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar9 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar9) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar9 - 1;
                    auVar96._8_4_ = (int)lVar23;
                    auVar96._0_8_ = lVar23;
                    auVar96._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar96 = auVar96 ^ _DAT_0016e020;
                    do {
                      auVar179._8_4_ = (int)uVar28;
                      auVar179._0_8_ = uVar28;
                      auVar179._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar179 | auVar107) ^ auVar76;
                      iVar14 = auVar96._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar96._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)&pMVar19->data + uVar28 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != auVar96._12_4_ || auVar205._8_4_ <= auVar96._8_4_) &&
                          auVar205._12_4_ <= auVar96._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar179 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar96._0_4_)) {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0xff7fffff;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0xff7fffff;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar12 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                          fVar35 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                          if (fVar1 <= fVar35) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar31 + (long)pMVar12 * 4) = fVar1;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        } while (pMVar25 != pMVar12);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            goto LAB_0013e327;
          }
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar32 = pvVar31;
                do {
                  auVar121 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar10) {
                    pMVar33 = (Mat *)0x0;
                    auVar121 = ZEXT816(0xff7fffff);
                    do {
                      fVar35 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                      if (auVar121._0_4_ <= fVar35) {
                        auVar121._0_4_ = fVar35;
                      }
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                    } while (pMVar25 != pMVar33);
                  }
                  *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                       auVar121._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                } while (uVar30 != uVar28);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar12 != pMVar20);
          }
        }
      }
      else if (uVar10 == 2) {
        uVar10 = bottom_blob->w;
        pMVar25 = (Mat *)(ulong)uVar10;
        uVar9 = bottom_blob->h;
        pMVar20 = (Mat *)(long)(int)uVar9;
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar58._0_8_ = SUB168(auVar57 ^ auVar107,0) << 0x3f;
        auVar58._8_8_ = SUB168(auVar57 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(uVar13,auVar58);
        if (iVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar9 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
          pMVar33 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
            pMVar19 = pMVar33;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar9 < 1) {
            fVar35 = -3.4028235e+38;
          }
          else {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar33 = (Mat *)0x0;
            do {
              fVar35 = -3.4028235e+38;
              if (0 < (int)uVar10) {
                pMVar19 = (Mat *)0x0;
                fVar35 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar25 != pMVar19);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar33 * 4) = fVar35;
              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar33 != pMVar20);
            fVar35 = -3.4028235e+38;
            pMVar25 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              if (fVar35 <= fVar1) {
                fVar35 = fVar1;
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d38d;
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
        else if (((bVar15 | (byte)iVar14 >> 1) & 1) == 0) {
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = -3.4028235e+38;
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                fVar35 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  if (fVar35 <= fVar1) {
                    fVar35 = fVar1;
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
        else if (((bVar16 | (byte)iVar14) & 1) == 0) {
          pMVar19 = pMVar25;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          auVar69 = _DAT_0016f1f0;
          auVar76 = _DAT_0016e020;
          auVar107 = _DAT_0016e010;
          uVar22 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar22) {
            pvVar31 = top_blob->data;
            lVar23 = (ulong)uVar22 - 1;
            auVar59._8_4_ = (int)lVar23;
            auVar59._0_8_ = lVar23;
            auVar59._12_4_ = (int)((ulong)lVar23 >> 0x20);
            uVar28 = 0;
            auVar59 = auVar59 ^ _DAT_0016e020;
            do {
              auVar142._8_4_ = (int)uVar28;
              auVar142._0_8_ = uVar28;
              auVar142._12_4_ = (int)(uVar28 >> 0x20);
              auVar205 = (auVar142 | auVar107) ^ auVar76;
              iVar14 = auVar59._4_4_;
              iVar8 = auVar59._12_4_;
              if ((bool)(~(auVar205._4_4_ == iVar14 && auVar59._0_4_ < auVar205._0_4_ ||
                          iVar14 < auVar205._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0xff7fffff;
              }
              if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar59._8_4_) &&
                  auVar205._12_4_ <= iVar8) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0xff7fffff;
              }
              auVar205 = (auVar142 | auVar69) ^ auVar76;
              auVar207._0_4_ = -(uint)(auVar59._0_4_ < auVar205._0_4_);
              auVar207._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
              auVar207._8_4_ = -(uint)(auVar59._8_4_ < auVar205._8_4_);
              auVar207._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
              iVar14 = -(uint)(auVar205._4_4_ == iVar14);
              iVar8 = -(uint)(auVar205._12_4_ == iVar8);
              auVar222._4_4_ = iVar14;
              auVar222._0_4_ = iVar14;
              auVar222._8_4_ = iVar8;
              auVar222._12_4_ = iVar8;
              auVar143._4_4_ = auVar207._4_4_;
              auVar143._0_4_ = auVar207._4_4_;
              auVar143._8_4_ = auVar207._12_4_;
              auVar143._12_4_ = auVar207._12_4_;
              auVar144._8_4_ = 0xffffffff;
              auVar144._0_8_ = 0xffffffffffffffff;
              auVar144._12_4_ = 0xffffffff;
              auVar144 = (auVar143 | auVar222 & auVar207) ^ auVar144;
              if ((auVar144 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0xff7fffff;
              }
              pMVar19 = (Mat *)(ulong)auVar144._8_2_;
              if ((auVar144 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0xff7fffff;
              }
              uVar28 = uVar28 + 4;
            } while ((uVar22 + 3 & 0xfffffffc) != uVar28);
          }
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                  if (fVar1 <= fVar35) {
                    fVar1 = fVar35;
                  }
                  *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
      }
      else if (uVar10 == 1) {
        iVar14 = bottom_blob->w;
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar14 < 1) goto LAB_00138ce5;
        fVar35 = -3.4028235e+38;
        lVar23 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar23 * 4);
          if (fVar35 <= fVar1) {
            fVar35 = fVar1;
          }
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
        goto LAB_00138ced;
      }
    }
    else if (uVar10 == 3) {
      uVar10 = bottom_blob->w;
      lVar23 = (long)(int)uVar10;
      uVar9 = bottom_blob->h;
      uVar28 = (ulong)uVar9;
      iVar8 = bottom_blob->c;
      pMVar20 = (Mat *)(long)iVar8;
      uVar22 = uVar9 * uVar10;
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar42._0_8_ = SUB168(auVar41 ^ auVar107,0) << 0x3f;
      auVar42._8_8_ = SUB168(auVar41 ^ auVar107,8) << 0x3f;
      iVar14 = movmskpd(3,auVar42);
      bVar24 = reduce_c ^ 1;
      if (iVar14 == 0 && bVar24 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        if (iVar8 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
        pMVar25 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
          pMVar12 = (Mat *)0x0;
          if (iVar14 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar25;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar8 < 1) {
          fVar35 = -3.4028235e+38;
        }
        else {
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar31 = bottom_blob->data;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = -3.4028235e+38;
            if (0 < (int)uVar22) {
              uVar30 = 0;
              fVar35 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + uVar30 * 4);
                if (fVar35 <= fVar1) {
                  fVar35 = fVar1;
                }
                uVar30 = uVar30 + 1;
              } while (uVar22 != uVar30);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar19 != pMVar20);
          fVar35 = -3.4028235e+38;
          pMVar25 = (Mat *)0x0;
          do {
            fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            if (fVar35 <= fVar1) {
              fVar35 = fVar1;
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) {
LAB_0013d38d:
            free(pMVar12);
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
      }
      else if (iVar14 == 0 && reduce_c == false) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,1,iVar8,sVar2,opt->blob_allocator);
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar25 = (Mat *)0x0;
          do {
            fVar35 = -3.4028235e+38;
            if (0 < (int)uVar22) {
              uVar28 = 0;
              fVar35 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + uVar28 * 4);
                if (fVar35 <= fVar1) {
                  fVar35 = fVar1;
                }
                uVar28 = uVar28 + 1;
              } while (uVar22 != uVar28);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * (long)pMVar25) = fVar35;
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar25 != pMVar20);
        }
      }
      else {
        pMVar25 = (Mat *)(ulong)uVar10;
        bVar21 = (byte)iVar14 >> 1 | bVar15;
        if (reduce_c == false && (bVar21 & 1) == 0) {
          pMVar19 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar9,iVar8,sVar2,opt->blob_allocator);
          if (0 < iVar8) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
            sVar3 = bottom_blob->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar32 = pvVar31;
                do {
                  auVar118 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar10) {
                    pMVar33 = (Mat *)0x0;
                    auVar118 = ZEXT816(0xff7fffff);
                    do {
                      fVar35 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                      if (auVar118._0_4_ <= fVar35) {
                        auVar118._0_4_ = fVar35;
                      }
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                    } while (pMVar25 != pMVar33);
                  }
                  *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                       auVar118._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                } while (uVar30 != uVar28);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar12 != pMVar20);
          }
        }
        else {
          if ((bVar21 & 1) == 0 && bVar24 == 0) {
            Mat::create(top_blob,1,uVar9,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)0x1;
            Mat::create((Mat *)&ptr,1,uVar9,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar77._8_4_ = (int)lVar17;
                  auVar77._0_8_ = lVar17;
                  auVar77._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar77 = auVar77 ^ _DAT_0016e020;
                  do {
                    auVar160._8_4_ = (int)pMVar19;
                    auVar160._0_8_ = pMVar19;
                    auVar160._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar160 | auVar107) ^ auVar76;
                    iVar14 = auVar77._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar77._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0xff7fffff;
                    }
                    if ((auVar205._12_4_ != auVar77._12_4_ || auVar205._8_4_ <= auVar77._8_4_) &&
                        auVar205._12_4_ <= auVar77._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0xff7fffff;
                    }
                    auVar205 = (auVar160 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar77._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0xff7fffff;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      pvVar26 = pvVar31;
                      do {
                        auVar124 = ZEXT816(0xff7fffff);
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          auVar124 = ZEXT816(0xff7fffff);
                          do {
                            fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            if (auVar124._0_4_ <= fVar35) {
                              auVar124._0_4_ = fVar35;
                            }
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        *(int *)((long)ptr +
                                uVar30 * 4 +
                                CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                             auVar124._0_4_;
                        uVar30 = uVar30 + 1;
                        pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                      } while (uVar30 != uVar28);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar78._8_4_ = (int)lVar23;
                  auVar78._0_8_ = lVar23;
                  auVar78._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar30 = 0;
                  auVar78 = auVar78 ^ _DAT_0016e020;
                  do {
                    auVar161._8_4_ = (int)uVar30;
                    auVar161._0_8_ = uVar30;
                    auVar161._12_4_ = (int)(uVar30 >> 0x20);
                    auVar205 = (auVar161 | auVar107) ^ auVar76;
                    iVar14 = auVar78._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar78._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)&pMVar19->data + uVar30 * 4) = 0xff7fffff;
                    }
                    if ((auVar205._12_4_ != auVar78._12_4_ || auVar205._8_4_ <= auVar78._8_4_) &&
                        auVar205._12_4_ <= auVar78._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0xff7fffff;
                    }
                    auVar205 = (auVar161 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar78._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0xff7fffff;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0xff7fffff;
                    }
                    uVar30 = uVar30 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar26 + uVar30 * 4);
                        fVar35 = *(float *)((long)pvVar31 + uVar30 * 4);
                        if (fVar1 <= fVar35) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar31 + uVar30 * 4) = fVar1;
                        uVar30 = uVar30 + 1;
                      } while (uVar28 != uVar30);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
          else {
            bVar21 = (byte)iVar14 | bVar16;
            if ((bVar21 & 1) != 0 || bVar24 != 0) {
              if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                Mat::create(top_blob,uVar10,uVar9,1,sVar2,opt->blob_allocator);
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pvVar31 = top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar101._8_4_ = (int)lVar23;
                  auVar101._0_8_ = lVar23;
                  auVar101._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar101 = auVar101 ^ _DAT_0016e020;
                  do {
                    auVar184._8_4_ = (int)uVar28;
                    auVar184._0_8_ = uVar28;
                    auVar184._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar184 | auVar107) ^ auVar76;
                    iVar14 = auVar101._4_4_;
                    iVar202 = auVar101._12_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar101._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0xff7fffff;
                    }
                    if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar101._8_4_) &&
                        auVar205._12_4_ <= iVar202) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0xff7fffff;
                    }
                    auVar205 = (auVar184 | auVar69) ^ auVar76;
                    auVar213._0_4_ = -(uint)(auVar101._0_4_ < auVar205._0_4_);
                    auVar213._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                    auVar213._8_4_ = -(uint)(auVar101._8_4_ < auVar205._8_4_);
                    auVar213._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
                    iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                    iVar202 = -(uint)(auVar205._12_4_ == iVar202);
                    auVar228._4_4_ = iVar14;
                    auVar228._0_4_ = iVar14;
                    auVar228._8_4_ = iVar202;
                    auVar228._12_4_ = iVar202;
                    auVar185._4_4_ = auVar213._4_4_;
                    auVar185._0_4_ = auVar213._4_4_;
                    auVar185._8_4_ = auVar213._12_4_;
                    auVar185._12_4_ = auVar213._12_4_;
                    auVar186._8_4_ = 0xffffffff;
                    auVar186._0_8_ = 0xffffffffffffffff;
                    auVar186._12_4_ = 0xffffffff;
                    auVar186 = (auVar185 | auVar228 & auVar213) ^ auVar186;
                    if ((auVar186 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0xff7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar186._8_2_;
                    if ((auVar186 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                }
                pMVar19 = pMVar25;
                if (0 < iVar8) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar31 = bottom_blob->data;
                  pvVar26 = top_blob->data;
                  pMVar19 = (Mat *)(ulong)uVar22;
                  pMVar25 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar22) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                        fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                        if (fVar1 <= fVar35) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar19 != pMVar12);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                  } while (pMVar25 != pMVar20);
                }
              }
              else {
                pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                if (reduce_c == false && (bVar21 & 1) == 0) {
                  pMVar19 = (Mat *)(ulong)uVar10;
                  Mat::create(top_blob,uVar10,1,iVar8,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  sVar2 = top_blob->cstep;
                  uVar22 = top_blob->c * (int)sVar2;
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar22 - 1;
                    auVar43._8_4_ = (int)lVar23;
                    auVar43._0_8_ = lVar23;
                    auVar43._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar43 = auVar43 ^ _DAT_0016e020;
                    do {
                      auVar133._8_4_ = (int)pMVar19;
                      auVar133._0_8_ = pMVar19;
                      auVar133._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar133 | auVar107) ^ auVar76;
                      iVar14 = auVar43._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar43._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4) = 0xff7fffff;
                      }
                      if ((auVar205._12_4_ != auVar43._12_4_ || auVar205._8_4_ <= auVar43._8_4_) &&
                          auVar205._12_4_ <= auVar43._12_4_) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 4) = 0xff7fffff;
                      }
                      auVar205 = (auVar133 | auVar69) ^ auVar76;
                      iVar202 = auVar205._4_4_;
                      if (iVar202 <= iVar14 &&
                          (iVar202 != iVar14 || auVar205._0_4_ <= auVar43._0_4_)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 0xc) = 0xff7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < iVar8) {
                    pvVar31 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    pMVar19 = (Mat *)top_blob->data;
                    sVar4 = bottom_blob->cstep;
                    sVar5 = top_blob->elemsize;
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar22 = 0;
                        pvVar26 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              fVar35 = *(float *)((long)&pMVar19->data + (long)pMVar33 * 4);
                              if (fVar1 <= fVar35) {
                                fVar1 = fVar35;
                              }
                              *(float *)((long)&pMVar19->data + (long)pMVar33 * 4) = fVar1;
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar22 = uVar22 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
                        } while (uVar22 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar3 * sVar4);
                      pMVar19 = (Mat *)((long)&pMVar19->data + sVar2 * sVar5);
                    } while (pMVar12 != pMVar20);
                  }
                }
              }
              goto LAB_00138cf9;
            }
            Mat::create(top_blob,uVar10,1,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)(ulong)uVar10;
            Mat::create((Mat *)&ptr,uVar10,1,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar89._8_4_ = (int)lVar17;
                  auVar89._0_8_ = lVar17;
                  auVar89._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar89 = auVar89 ^ _DAT_0016e020;
                  do {
                    auVar172._8_4_ = (int)pMVar19;
                    auVar172._0_8_ = pMVar19;
                    auVar172._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar172 | auVar107) ^ auVar76;
                    iVar14 = auVar89._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar89._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0xff7fffff;
                    }
                    if ((auVar205._12_4_ != auVar89._12_4_ || auVar205._8_4_ <= auVar89._8_4_) &&
                        auVar205._12_4_ <= auVar89._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0xff7fffff;
                    }
                    auVar205 = (auVar172 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar89._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0xff7fffff;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      pvVar32 = pvVar31;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                            fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            if (fVar1 <= fVar35) {
                              fVar1 = fVar35;
                            }
                            *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        uVar22 = uVar22 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                      } while (uVar22 != uVar9);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    pvVar26 = (void *)((long)pvVar26 +
                                      CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar9 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar9) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar9 - 1;
                  auVar90._8_4_ = (int)lVar23;
                  auVar90._0_8_ = lVar23;
                  auVar90._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar90 = auVar90 ^ _DAT_0016e020;
                  do {
                    auVar173._8_4_ = (int)uVar28;
                    auVar173._0_8_ = uVar28;
                    auVar173._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar173 | auVar107) ^ auVar76;
                    iVar14 = auVar90._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar90._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)&pMVar19->data + uVar28 * 4) = 0xff7fffff;
                    }
                    if ((auVar205._12_4_ != auVar90._12_4_ || auVar205._8_4_ <= auVar90._8_4_) &&
                        auVar205._12_4_ <= auVar90._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0xff7fffff;
                    }
                    auVar205 = (auVar173 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar90._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0xff7fffff;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0xff7fffff;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                        fVar35 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                        if (fVar1 <= fVar35) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar31 + (long)pMVar12 * 4) = fVar1;
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar25 != pMVar12);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
LAB_0013e327:
          Mat::~Mat((Mat *)&ptr);
          if (iVar14 != 0) {
            return -100;
          }
        }
      }
    }
    else if (uVar10 == 2) {
      uVar10 = bottom_blob->w;
      pMVar25 = (Mat *)(ulong)uVar10;
      iVar14 = bottom_blob->h;
      pMVar20 = (Mat *)(long)iVar14;
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar39._0_8_ = SUB168(auVar38 ^ auVar107,0) << 0x3f;
      auVar39._8_8_ = SUB168(auVar38 ^ auVar107,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar39);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        if (iVar14 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
        pMVar33 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar8 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
          pMVar12 = (Mat *)0x0;
          if (iVar8 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
          pMVar19 = pMVar33;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar14 < 1) {
          fVar35 = -3.4028235e+38;
        }
        else {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar33 = (Mat *)0x0;
          do {
            fVar35 = -3.4028235e+38;
            if (0 < (int)uVar10) {
              pMVar19 = (Mat *)0x0;
              fVar35 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                if (fVar35 <= fVar1) {
                  fVar35 = fVar1;
                }
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar25 != pMVar19);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar33 * 4) = fVar35;
            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar33 != pMVar20);
          fVar35 = -3.4028235e+38;
          pMVar25 = (Mat *)0x0;
          do {
            fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            if (fVar35 <= fVar1) {
              fVar35 = fVar1;
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) goto LAB_0013d38d;
          (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
          pMVar19 = pMVar12;
        }
      }
      else if (((bVar15 | (byte)iVar8 >> 1) & 1) == 0) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,iVar14,sVar2,opt->blob_allocator);
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = -3.4028235e+38;
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              fVar35 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                if (fVar35 <= fVar1) {
                  fVar35 = fVar1;
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
      else if (((bVar16 | (byte)iVar8) & 1) == 0) {
        pMVar19 = pMVar25;
        Mat::create(top_blob,uVar10,1,sVar2,opt->blob_allocator);
        auVar69 = _DAT_0016f1f0;
        auVar76 = _DAT_0016e020;
        auVar107 = _DAT_0016e010;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar31 = top_blob->data;
          lVar23 = (ulong)uVar9 - 1;
          auVar40._8_4_ = (int)lVar23;
          auVar40._0_8_ = lVar23;
          auVar40._12_4_ = (int)((ulong)lVar23 >> 0x20);
          uVar28 = 0;
          auVar40 = auVar40 ^ _DAT_0016e020;
          do {
            auVar130._8_4_ = (int)uVar28;
            auVar130._0_8_ = uVar28;
            auVar130._12_4_ = (int)(uVar28 >> 0x20);
            auVar205 = (auVar130 | auVar107) ^ auVar76;
            iVar8 = auVar40._4_4_;
            iVar202 = auVar40._12_4_;
            if ((bool)(~(auVar205._4_4_ == iVar8 && auVar40._0_4_ < auVar205._0_4_ ||
                        iVar8 < auVar205._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0xff7fffff;
            }
            if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar40._8_4_) &&
                auVar205._12_4_ <= iVar202) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0xff7fffff;
            }
            auVar205 = (auVar130 | auVar69) ^ auVar76;
            auVar203._0_4_ = -(uint)(auVar40._0_4_ < auVar205._0_4_);
            auVar203._4_4_ = -(uint)(iVar8 < auVar205._4_4_);
            auVar203._8_4_ = -(uint)(auVar40._8_4_ < auVar205._8_4_);
            auVar203._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
            iVar8 = -(uint)(auVar205._4_4_ == iVar8);
            iVar202 = -(uint)(auVar205._12_4_ == iVar202);
            auVar219._4_4_ = iVar8;
            auVar219._0_4_ = iVar8;
            auVar219._8_4_ = iVar202;
            auVar219._12_4_ = iVar202;
            auVar131._4_4_ = auVar203._4_4_;
            auVar131._0_4_ = auVar203._4_4_;
            auVar131._8_4_ = auVar203._12_4_;
            auVar131._12_4_ = auVar203._12_4_;
            auVar132._8_4_ = 0xffffffff;
            auVar132._0_8_ = 0xffffffffffffffff;
            auVar132._12_4_ = 0xffffffff;
            auVar132 = (auVar131 | auVar219 & auVar203) ^ auVar132;
            if ((auVar132 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0xff7fffff;
            }
            pMVar19 = (Mat *)(ulong)auVar132._8_2_;
            if ((auVar132 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0xff7fffff;
            }
            uVar28 = uVar28 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
        }
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                if (fVar1 <= fVar35) {
                  fVar1 = fVar35;
                }
                *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
    }
    else if (uVar10 == 1) {
      iVar14 = bottom_blob->w;
      pMVar19 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar14 < 1) {
LAB_00138ce5:
        fVar35 = -3.4028235e+38;
      }
      else {
        fVar35 = -3.4028235e+38;
        lVar23 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar23 * 4);
          if (fVar35 <= fVar1) {
            fVar35 = fVar1;
          }
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
      }
LAB_00138ced:
      *(float *)top_blob->data = fVar35;
    }
LAB_00138cf9:
    if (ABS(fVar34 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_001398af;
  case 5:
    fVar34 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar10 == 3) {
        uVar10 = bottom_blob->w;
        lVar23 = (long)(int)uVar10;
        uVar9 = bottom_blob->h;
        uVar28 = (ulong)uVar9;
        uVar22 = bottom_blob->c;
        pMVar20 = (Mat *)(long)(int)uVar22;
        uVar18 = uVar9 * uVar10;
        auVar70._8_4_ = 0xffffffff;
        auVar70._0_8_ = 0xffffffffffffffff;
        auVar70._12_4_ = 0xffffffff;
        auVar71._0_8_ = SUB168(auVar70 ^ auVar107,0) << 0x3f;
        auVar71._8_8_ = SUB168(auVar70 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(3,auVar71);
        bVar24 = reduce_c ^ 1;
        if (iVar14 == 0 && bVar24 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar22 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
          pMVar25 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar25;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar22 < 1) {
            fVar35 = 3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar31 = bottom_blob->data;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = 3.4028235e+38;
              if (0 < (int)uVar18) {
                uVar30 = 0;
                fVar35 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + uVar30 * 4);
                  if (fVar1 <= fVar35) {
                    fVar35 = fVar1;
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar19 != pMVar20);
            fVar35 = 3.4028235e+38;
            pMVar25 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              if (fVar1 <= fVar35) {
                fVar35 = fVar1;
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3a4;
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
        else if (iVar14 == 0 && reduce_c == false) {
          pMVar19 = (Mat *)(ulong)uVar22;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)(ulong)uVar18;
            pMVar25 = (Mat *)0x0;
            do {
              fVar35 = 3.4028235e+38;
              if (0 < (int)uVar18) {
                pMVar12 = (Mat *)0x0;
                fVar35 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  if (fVar1 <= fVar35) {
                    fVar35 = fVar1;
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar19 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar25 * 4) = fVar35;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar25 != pMVar20);
          }
        }
        else {
          pMVar25 = (Mat *)(ulong)uVar10;
          bVar21 = (byte)iVar14 >> 1 | bVar15;
          if (reduce_c != false || (bVar21 & 1) != 0) {
            if ((bVar21 & 1) == 0 && bVar24 == 0) {
              Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar9,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar85._8_4_ = (int)lVar17;
                    auVar85._0_8_ = lVar17;
                    auVar85._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar85 = auVar85 ^ _DAT_0016e020;
                    do {
                      auVar168._8_4_ = (int)pMVar19;
                      auVar168._0_8_ = pMVar19;
                      auVar168._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar168 | auVar107) ^ auVar76;
                      iVar14 = auVar85._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar85._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != auVar85._12_4_ || auVar205._8_4_ <= auVar85._8_4_) &&
                          auVar205._12_4_ <= auVar85._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar168 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar85._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x7f7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x7f7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        pvVar26 = pvVar31;
                        do {
                          auVar128 = ZEXT816(0x7f7fffff);
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            auVar128 = ZEXT816(0x7f7fffff);
                            do {
                              fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              if (fVar35 <= auVar128._0_4_) {
                                auVar128._0_4_ = fVar35;
                              }
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          *(int *)((long)ptr +
                                  uVar30 * 4 +
                                  CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                               auVar128._0_4_;
                          uVar30 = uVar30 + 1;
                          pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                        } while (uVar30 != uVar28);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar86._8_4_ = (int)lVar23;
                    auVar86._0_8_ = lVar23;
                    auVar86._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar30 = 0;
                    auVar86 = auVar86 ^ _DAT_0016e020;
                    do {
                      auVar169._8_4_ = (int)uVar30;
                      auVar169._0_8_ = uVar30;
                      auVar169._12_4_ = (int)(uVar30 >> 0x20);
                      auVar205 = (auVar169 | auVar107) ^ auVar76;
                      iVar14 = auVar86._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar86._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(int *)((long)&pMVar19->data + uVar30 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != auVar86._12_4_ || auVar205._8_4_ <= auVar86._8_4_) &&
                          auVar205._12_4_ <= auVar86._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar169 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar86._0_4_)) {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0x7f7fffff;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0x7f7fffff;
                      }
                      uVar30 = uVar30 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar26 + uVar30 * 4);
                          fVar35 = *(float *)((long)pvVar31 + uVar30 * 4);
                          if (fVar35 <= fVar1) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar31 + uVar30 * 4) = fVar1;
                          uVar30 = uVar30 + 1;
                        } while (uVar28 != uVar30);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            else {
              bVar21 = (byte)iVar14 | bVar16;
              if ((bVar21 & 1) != 0 || bVar24 != 0) {
                if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                  Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar105._8_4_ = (int)lVar23;
                    auVar105._0_8_ = lVar23;
                    auVar105._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar105 = auVar105 ^ _DAT_0016e020;
                    do {
                      auVar196._8_4_ = (int)uVar28;
                      auVar196._0_8_ = uVar28;
                      auVar196._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar196 | auVar107) ^ auVar76;
                      iVar14 = auVar105._4_4_;
                      iVar8 = auVar105._12_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar105._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar105._8_4_) &&
                          auVar205._12_4_ <= iVar8) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar196 | auVar69) ^ auVar76;
                      auVar217._0_4_ = -(uint)(auVar105._0_4_ < auVar205._0_4_);
                      auVar217._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                      auVar217._8_4_ = -(uint)(auVar105._8_4_ < auVar205._8_4_);
                      auVar217._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                      iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                      iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                      auVar232._4_4_ = iVar14;
                      auVar232._0_4_ = iVar14;
                      auVar232._8_4_ = iVar8;
                      auVar232._12_4_ = iVar8;
                      auVar197._4_4_ = auVar217._4_4_;
                      auVar197._0_4_ = auVar217._4_4_;
                      auVar197._8_4_ = auVar217._12_4_;
                      auVar197._12_4_ = auVar217._12_4_;
                      auVar198._8_4_ = 0xffffffff;
                      auVar198._0_8_ = 0xffffffffffffffff;
                      auVar198._12_4_ = 0xffffffff;
                      auVar198 = (auVar197 | auVar232 & auVar217) ^ auVar198;
                      if ((auVar198 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar25 = (Mat *)(ulong)auVar198._8_2_;
                      if ((auVar198 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                  }
                  pMVar19 = pMVar25;
                  if (0 < (int)uVar22) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar31 = bottom_blob->data;
                    pvVar26 = top_blob->data;
                    pMVar19 = (Mat *)(ulong)uVar18;
                    pMVar25 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar18) {
                        pMVar12 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                          fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                          if (fVar35 <= fVar1) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        } while (pMVar19 != pMVar12);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                    } while (pMVar25 != pMVar20);
                  }
                }
                else {
                  pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                  if (reduce_c == false && (bVar21 & 1) == 0) {
                    pMVar19 = (Mat *)(ulong)uVar10;
                    Mat::create(top_blob,uVar10,uVar22,sVar2,opt->blob_allocator);
                    auVar69 = _DAT_0016f1f0;
                    auVar76 = _DAT_0016e020;
                    auVar107 = _DAT_0016e010;
                    uVar18 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar18) {
                      pvVar31 = top_blob->data;
                      lVar23 = (ulong)uVar18 - 1;
                      auVar72._8_4_ = (int)lVar23;
                      auVar72._0_8_ = lVar23;
                      auVar72._12_4_ = (int)((ulong)lVar23 >> 0x20);
                      uVar28 = 0;
                      auVar72 = auVar72 ^ _DAT_0016e020;
                      do {
                        auVar154._8_4_ = (int)uVar28;
                        auVar154._0_8_ = uVar28;
                        auVar154._12_4_ = (int)(uVar28 >> 0x20);
                        auVar205 = (auVar154 | auVar107) ^ auVar76;
                        iVar14 = auVar72._4_4_;
                        iVar8 = auVar72._12_4_;
                        if ((bool)(~(auVar205._4_4_ == iVar14 && auVar72._0_4_ < auVar205._0_4_ ||
                                    iVar14 < auVar205._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x7f7fffff;
                        }
                        if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar72._8_4_) &&
                            auVar205._12_4_ <= iVar8) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar205 = (auVar154 | auVar69) ^ auVar76;
                        auVar211._0_4_ = -(uint)(auVar72._0_4_ < auVar205._0_4_);
                        auVar211._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                        auVar211._8_4_ = -(uint)(auVar72._8_4_ < auVar205._8_4_);
                        auVar211._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                        iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                        iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                        auVar226._4_4_ = iVar14;
                        auVar226._0_4_ = iVar14;
                        auVar226._8_4_ = iVar8;
                        auVar226._12_4_ = iVar8;
                        auVar155._4_4_ = auVar211._4_4_;
                        auVar155._0_4_ = auVar211._4_4_;
                        auVar155._8_4_ = auVar211._12_4_;
                        auVar155._12_4_ = auVar211._12_4_;
                        auVar156._8_4_ = 0xffffffff;
                        auVar156._0_8_ = 0xffffffffffffffff;
                        auVar156._12_4_ = 0xffffffff;
                        auVar156 = (auVar155 | auVar226 & auVar211) ^ auVar156;
                        if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x7f7fffff;
                        }
                        pMVar19 = (Mat *)(ulong)auVar156._8_2_;
                        if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x7f7fffff;
                        }
                        uVar28 = uVar28 + 4;
                      } while ((uVar18 + 3 & 0xfffffffc) != uVar28);
                    }
                    if (0 < (int)uVar22) {
                      pvVar31 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar26 = top_blob->data;
                      pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                      sVar3 = bottom_blob->cstep;
                      pMVar12 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar9) {
                          uVar22 = 0;
                          pvVar32 = pvVar31;
                          do {
                            if (0 < (int)uVar10) {
                              pMVar33 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                                fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                                if (fVar35 <= fVar1) {
                                  fVar1 = fVar35;
                                }
                                *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                                pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                              } while (pMVar25 != pMVar33);
                            }
                            uVar22 = uVar22 + 1;
                            pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar10 * 4);
                          } while (uVar22 != uVar9);
                        }
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                        pvVar26 = (void *)((long)&pMVar19->data + (long)pvVar26);
                      } while (pMVar12 != pMVar20);
                    }
                  }
                }
                break;
              }
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)(ulong)uVar10;
              Mat::create((Mat *)&ptr,uVar10,1,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar97._8_4_ = (int)lVar17;
                    auVar97._0_8_ = lVar17;
                    auVar97._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar97 = auVar97 ^ _DAT_0016e020;
                    do {
                      auVar180._8_4_ = (int)pMVar19;
                      auVar180._0_8_ = pMVar19;
                      auVar180._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar180 | auVar107) ^ auVar76;
                      iVar14 = auVar97._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar97._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != auVar97._12_4_ || auVar205._8_4_ <= auVar97._8_4_) &&
                          auVar205._12_4_ <= auVar97._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar180 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar97._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x7f7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x7f7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar18 = 0;
                        pvVar32 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                              fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              if (fVar35 <= fVar1) {
                                fVar1 = fVar35;
                              }
                              *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar18 = uVar18 + 1;
                          pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                        } while (uVar18 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                      pvVar26 = (void *)((long)pvVar26 +
                                        CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar9 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar9) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar9 - 1;
                    auVar98._8_4_ = (int)lVar23;
                    auVar98._0_8_ = lVar23;
                    auVar98._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar98 = auVar98 ^ _DAT_0016e020;
                    do {
                      auVar181._8_4_ = (int)uVar28;
                      auVar181._0_8_ = uVar28;
                      auVar181._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar181 | auVar107) ^ auVar76;
                      iVar14 = auVar98._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar98._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(int *)((long)&pMVar19->data + uVar28 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != auVar98._12_4_ || auVar205._8_4_ <= auVar98._8_4_) &&
                          auVar205._12_4_ <= auVar98._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar181 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar98._0_4_)) {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0x7f7fffff;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0x7f7fffff;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar12 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                          fVar35 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                          if (fVar35 <= fVar1) {
                            fVar1 = fVar35;
                          }
                          *(float *)((long)pvVar31 + (long)pMVar12 * 4) = fVar1;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        } while (pMVar25 != pMVar12);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            goto LAB_0013e696;
          }
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar32 = pvVar31;
                do {
                  auVar122 = ZEXT816(0x7f7fffff);
                  if (0 < (int)uVar10) {
                    pMVar33 = (Mat *)0x0;
                    auVar122 = ZEXT816(0x7f7fffff);
                    do {
                      fVar35 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                      if (fVar35 <= auVar122._0_4_) {
                        auVar122._0_4_ = fVar35;
                      }
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                    } while (pMVar25 != pMVar33);
                  }
                  *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                       auVar122._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                } while (uVar30 != uVar28);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar12 != pMVar20);
          }
        }
      }
      else if (uVar10 == 2) {
        uVar10 = bottom_blob->w;
        pMVar25 = (Mat *)(ulong)uVar10;
        uVar9 = bottom_blob->h;
        pMVar20 = (Mat *)(long)(int)uVar9;
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar64._0_8_ = SUB168(auVar63 ^ auVar107,0) << 0x3f;
        auVar64._8_8_ = SUB168(auVar63 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(uVar13,auVar64);
        if (iVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar9 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
          pMVar33 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
            pMVar19 = pMVar33;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar9 < 1) {
            fVar35 = 3.4028235e+38;
          }
          else {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar33 = (Mat *)0x0;
            do {
              fVar35 = 3.4028235e+38;
              if (0 < (int)uVar10) {
                pMVar19 = (Mat *)0x0;
                fVar35 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                  if (fVar1 <= fVar35) {
                    fVar35 = fVar1;
                  }
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar25 != pMVar19);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar33 * 4) = fVar35;
              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar33 != pMVar20);
            fVar35 = 3.4028235e+38;
            pMVar25 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              if (fVar1 <= fVar35) {
                fVar35 = fVar1;
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3a4;
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
        else if (((bVar15 | (byte)iVar14 >> 1) & 1) == 0) {
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = 3.4028235e+38;
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                fVar35 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  if (fVar1 <= fVar35) {
                    fVar35 = fVar1;
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
        else if (((bVar16 | (byte)iVar14) & 1) == 0) {
          pMVar19 = pMVar25;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          auVar69 = _DAT_0016f1f0;
          auVar76 = _DAT_0016e020;
          auVar107 = _DAT_0016e010;
          uVar22 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar22) {
            pvVar31 = top_blob->data;
            lVar23 = (ulong)uVar22 - 1;
            auVar65._8_4_ = (int)lVar23;
            auVar65._0_8_ = lVar23;
            auVar65._12_4_ = (int)((ulong)lVar23 >> 0x20);
            uVar28 = 0;
            auVar65 = auVar65 ^ _DAT_0016e020;
            do {
              auVar148._8_4_ = (int)uVar28;
              auVar148._0_8_ = uVar28;
              auVar148._12_4_ = (int)(uVar28 >> 0x20);
              auVar205 = (auVar148 | auVar107) ^ auVar76;
              iVar14 = auVar65._4_4_;
              iVar8 = auVar65._12_4_;
              if ((bool)(~(auVar205._4_4_ == iVar14 && auVar65._0_4_ < auVar205._0_4_ ||
                          iVar14 < auVar205._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x7f7fffff;
              }
              if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar65._8_4_) &&
                  auVar205._12_4_ <= iVar8) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x7f7fffff;
              }
              auVar205 = (auVar148 | auVar69) ^ auVar76;
              auVar209._0_4_ = -(uint)(auVar65._0_4_ < auVar205._0_4_);
              auVar209._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
              auVar209._8_4_ = -(uint)(auVar65._8_4_ < auVar205._8_4_);
              auVar209._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
              iVar14 = -(uint)(auVar205._4_4_ == iVar14);
              iVar8 = -(uint)(auVar205._12_4_ == iVar8);
              auVar224._4_4_ = iVar14;
              auVar224._0_4_ = iVar14;
              auVar224._8_4_ = iVar8;
              auVar224._12_4_ = iVar8;
              auVar149._4_4_ = auVar209._4_4_;
              auVar149._0_4_ = auVar209._4_4_;
              auVar149._8_4_ = auVar209._12_4_;
              auVar149._12_4_ = auVar209._12_4_;
              auVar150._8_4_ = 0xffffffff;
              auVar150._0_8_ = 0xffffffffffffffff;
              auVar150._12_4_ = 0xffffffff;
              auVar150 = (auVar149 | auVar224 & auVar209) ^ auVar150;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x7f7fffff;
              }
              pMVar19 = (Mat *)(ulong)auVar150._8_2_;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar28 = uVar28 + 4;
            } while ((uVar22 + 3 & 0xfffffffc) != uVar28);
          }
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                  if (fVar35 <= fVar1) {
                    fVar1 = fVar35;
                  }
                  *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
      }
      else if (uVar10 == 1) {
        iVar14 = bottom_blob->w;
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar14 < 1) goto LAB_0013965d;
        fVar35 = 3.4028235e+38;
        lVar23 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar23 * 4);
          if (fVar1 <= fVar35) {
            fVar35 = fVar1;
          }
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
        goto LAB_00139665;
      }
    }
    else if (uVar10 == 3) {
      uVar10 = bottom_blob->w;
      lVar23 = (long)(int)uVar10;
      uVar9 = bottom_blob->h;
      uVar28 = (ulong)uVar9;
      iVar8 = bottom_blob->c;
      pMVar20 = (Mat *)(long)iVar8;
      uVar22 = uVar9 * uVar10;
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      auVar52._0_8_ = SUB168(auVar51 ^ auVar107,0) << 0x3f;
      auVar52._8_8_ = SUB168(auVar51 ^ auVar107,8) << 0x3f;
      iVar14 = movmskpd(3,auVar52);
      bVar24 = reduce_c ^ 1;
      if (iVar14 == 0 && bVar24 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        if (iVar8 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
        pMVar25 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
          pMVar12 = (Mat *)0x0;
          if (iVar14 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar25;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar8 < 1) {
          fVar35 = 3.4028235e+38;
        }
        else {
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar31 = bottom_blob->data;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = 3.4028235e+38;
            if (0 < (int)uVar22) {
              uVar30 = 0;
              fVar35 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + uVar30 * 4);
                if (fVar1 <= fVar35) {
                  fVar35 = fVar1;
                }
                uVar30 = uVar30 + 1;
              } while (uVar22 != uVar30);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar19 != pMVar20);
          fVar35 = 3.4028235e+38;
          pMVar25 = (Mat *)0x0;
          do {
            fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            if (fVar1 <= fVar35) {
              fVar35 = fVar1;
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) {
LAB_0013d3a4:
            free(pMVar12);
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
      }
      else if (iVar14 == 0 && reduce_c == false) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,1,iVar8,sVar2,opt->blob_allocator);
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar25 = (Mat *)0x0;
          do {
            fVar35 = 3.4028235e+38;
            if (0 < (int)uVar22) {
              uVar28 = 0;
              fVar35 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + uVar28 * 4);
                if (fVar1 <= fVar35) {
                  fVar35 = fVar1;
                }
                uVar28 = uVar28 + 1;
              } while (uVar22 != uVar28);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * (long)pMVar25) = fVar35;
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar25 != pMVar20);
        }
      }
      else {
        pMVar25 = (Mat *)(ulong)uVar10;
        bVar21 = (byte)iVar14 >> 1 | bVar15;
        if (reduce_c != false || (bVar21 & 1) != 0) {
          if ((bVar21 & 1) == 0 && bVar24 == 0) {
            Mat::create(top_blob,1,uVar9,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)0x1;
            Mat::create((Mat *)&ptr,1,uVar9,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar79._8_4_ = (int)lVar17;
                  auVar79._0_8_ = lVar17;
                  auVar79._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar79 = auVar79 ^ _DAT_0016e020;
                  do {
                    auVar162._8_4_ = (int)pMVar19;
                    auVar162._0_8_ = pMVar19;
                    auVar162._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar162 | auVar107) ^ auVar76;
                    iVar14 = auVar79._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar79._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x7f7fffff;
                    }
                    if ((auVar205._12_4_ != auVar79._12_4_ || auVar205._8_4_ <= auVar79._8_4_) &&
                        auVar205._12_4_ <= auVar79._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar205 = (auVar162 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar79._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x7f7fffff;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x7f7fffff;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      pvVar26 = pvVar31;
                      do {
                        auVar125 = ZEXT816(0x7f7fffff);
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          auVar125 = ZEXT816(0x7f7fffff);
                          do {
                            fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            if (fVar35 <= auVar125._0_4_) {
                              auVar125._0_4_ = fVar35;
                            }
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        *(int *)((long)ptr +
                                uVar30 * 4 +
                                CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                             auVar125._0_4_;
                        uVar30 = uVar30 + 1;
                        pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                      } while (uVar30 != uVar28);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar80._8_4_ = (int)lVar23;
                  auVar80._0_8_ = lVar23;
                  auVar80._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar30 = 0;
                  auVar80 = auVar80 ^ _DAT_0016e020;
                  do {
                    auVar163._8_4_ = (int)uVar30;
                    auVar163._0_8_ = uVar30;
                    auVar163._12_4_ = (int)(uVar30 >> 0x20);
                    auVar205 = (auVar163 | auVar107) ^ auVar76;
                    iVar14 = auVar80._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar80._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(int *)((long)&pMVar19->data + uVar30 * 4) = 0x7f7fffff;
                    }
                    if ((auVar205._12_4_ != auVar80._12_4_ || auVar205._8_4_ <= auVar80._8_4_) &&
                        auVar205._12_4_ <= auVar80._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar205 = (auVar163 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar80._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0x7f7fffff;
                    }
                    uVar30 = uVar30 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar26 + uVar30 * 4);
                        fVar35 = *(float *)((long)pvVar31 + uVar30 * 4);
                        if (fVar35 <= fVar1) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar31 + uVar30 * 4) = fVar1;
                        uVar30 = uVar30 + 1;
                      } while (uVar28 != uVar30);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
          else {
            bVar21 = (byte)iVar14 | bVar16;
            if ((bVar21 & 1) != 0 || bVar24 != 0) {
              if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                Mat::create(top_blob,uVar10,uVar9,1,sVar2,opt->blob_allocator);
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pvVar31 = top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar102._8_4_ = (int)lVar23;
                  auVar102._0_8_ = lVar23;
                  auVar102._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar102 = auVar102 ^ _DAT_0016e020;
                  do {
                    auVar187._8_4_ = (int)uVar28;
                    auVar187._0_8_ = uVar28;
                    auVar187._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar187 | auVar107) ^ auVar76;
                    iVar14 = auVar102._4_4_;
                    iVar202 = auVar102._12_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar102._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x7f7fffff;
                    }
                    if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar102._8_4_) &&
                        auVar205._12_4_ <= iVar202) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar205 = (auVar187 | auVar69) ^ auVar76;
                    auVar214._0_4_ = -(uint)(auVar102._0_4_ < auVar205._0_4_);
                    auVar214._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                    auVar214._8_4_ = -(uint)(auVar102._8_4_ < auVar205._8_4_);
                    auVar214._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
                    iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                    iVar202 = -(uint)(auVar205._12_4_ == iVar202);
                    auVar229._4_4_ = iVar14;
                    auVar229._0_4_ = iVar14;
                    auVar229._8_4_ = iVar202;
                    auVar229._12_4_ = iVar202;
                    auVar188._4_4_ = auVar214._4_4_;
                    auVar188._0_4_ = auVar214._4_4_;
                    auVar188._8_4_ = auVar214._12_4_;
                    auVar188._12_4_ = auVar214._12_4_;
                    auVar189._8_4_ = 0xffffffff;
                    auVar189._0_8_ = 0xffffffffffffffff;
                    auVar189._12_4_ = 0xffffffff;
                    auVar189 = (auVar188 | auVar229 & auVar214) ^ auVar189;
                    if ((auVar189 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar25 = (Mat *)(ulong)auVar189._8_2_;
                    if ((auVar189 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                }
                pMVar19 = pMVar25;
                if (0 < iVar8) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar31 = bottom_blob->data;
                  pvVar26 = top_blob->data;
                  pMVar19 = (Mat *)(ulong)uVar22;
                  pMVar25 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar22) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                        fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                        if (fVar35 <= fVar1) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar19 != pMVar12);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                  } while (pMVar25 != pMVar20);
                }
              }
              else {
                pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                if (reduce_c == false && (bVar21 & 1) == 0) {
                  pMVar19 = (Mat *)(ulong)uVar10;
                  Mat::create(top_blob,uVar10,1,iVar8,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  sVar2 = top_blob->cstep;
                  uVar22 = top_blob->c * (int)sVar2;
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar22 - 1;
                    auVar53._8_4_ = (int)lVar23;
                    auVar53._0_8_ = lVar23;
                    auVar53._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar53 = auVar53 ^ _DAT_0016e020;
                    do {
                      auVar140._8_4_ = (int)pMVar19;
                      auVar140._0_8_ = pMVar19;
                      auVar140._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar140 | auVar107) ^ auVar76;
                      iVar14 = auVar53._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar53._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4) = 0x7f7fffff;
                      }
                      if ((auVar205._12_4_ != auVar53._12_4_ || auVar205._8_4_ <= auVar53._8_4_) &&
                          auVar205._12_4_ <= auVar53._12_4_) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar205 = (auVar140 | auVar69) ^ auVar76;
                      iVar202 = auVar205._4_4_;
                      if (iVar202 <= iVar14 &&
                          (iVar202 != iVar14 || auVar205._0_4_ <= auVar53._0_4_)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 8) = 0x7f7fffff;
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 0xc) = 0x7f7fffff;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < iVar8) {
                    pvVar31 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    pMVar19 = (Mat *)top_blob->data;
                    sVar4 = bottom_blob->cstep;
                    sVar5 = top_blob->elemsize;
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar22 = 0;
                        pvVar26 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              fVar35 = *(float *)((long)&pMVar19->data + (long)pMVar33 * 4);
                              if (fVar35 <= fVar1) {
                                fVar1 = fVar35;
                              }
                              *(float *)((long)&pMVar19->data + (long)pMVar33 * 4) = fVar1;
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar22 = uVar22 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
                        } while (uVar22 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar3 * sVar4);
                      pMVar19 = (Mat *)((long)&pMVar19->data + sVar2 * sVar5);
                    } while (pMVar12 != pMVar20);
                  }
                }
              }
              break;
            }
            Mat::create(top_blob,uVar10,1,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)(ulong)uVar10;
            Mat::create((Mat *)&ptr,uVar10,1,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar91._8_4_ = (int)lVar17;
                  auVar91._0_8_ = lVar17;
                  auVar91._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar91 = auVar91 ^ _DAT_0016e020;
                  do {
                    auVar174._8_4_ = (int)pMVar19;
                    auVar174._0_8_ = pMVar19;
                    auVar174._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar174 | auVar107) ^ auVar76;
                    iVar14 = auVar91._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar91._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x7f7fffff;
                    }
                    if ((auVar205._12_4_ != auVar91._12_4_ || auVar205._8_4_ <= auVar91._8_4_) &&
                        auVar205._12_4_ <= auVar91._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar205 = (auVar174 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar91._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x7f7fffff;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x7f7fffff;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      pvVar32 = pvVar31;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                            fVar35 = *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            if (fVar35 <= fVar1) {
                              fVar1 = fVar35;
                            }
                            *(float *)((long)pvVar26 + (long)pMVar33 * 4) = fVar1;
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        uVar22 = uVar22 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                      } while (uVar22 != uVar9);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    pvVar26 = (void *)((long)pvVar26 +
                                      CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar9 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar9) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar9 - 1;
                  auVar92._8_4_ = (int)lVar23;
                  auVar92._0_8_ = lVar23;
                  auVar92._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar92 = auVar92 ^ _DAT_0016e020;
                  do {
                    auVar175._8_4_ = (int)uVar28;
                    auVar175._0_8_ = uVar28;
                    auVar175._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar175 | auVar107) ^ auVar76;
                    iVar14 = auVar92._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar92._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(int *)((long)&pMVar19->data + uVar28 * 4) = 0x7f7fffff;
                    }
                    if ((auVar205._12_4_ != auVar92._12_4_ || auVar205._8_4_ <= auVar92._8_4_) &&
                        auVar205._12_4_ <= auVar92._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar205 = (auVar175 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar92._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0x7f7fffff;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                        fVar35 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                        if (fVar35 <= fVar1) {
                          fVar1 = fVar35;
                        }
                        *(float *)((long)pvVar31 + (long)pMVar12 * 4) = fVar1;
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar25 != pMVar12);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
LAB_0013e696:
          Mat::~Mat((Mat *)&ptr);
          goto joined_r0x0013ea1c;
        }
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,uVar9,iVar8,sVar2,opt->blob_allocator);
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar12 = (Mat *)0x0;
          do {
            if (0 < (int)uVar9) {
              uVar30 = 0;
              pvVar32 = pvVar31;
              do {
                auVar119 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar10) {
                  pMVar33 = (Mat *)0x0;
                  auVar119 = ZEXT816(0x7f7fffff);
                  do {
                    fVar35 = *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                    if (fVar35 <= auVar119._0_4_) {
                      auVar119._0_4_ = fVar35;
                    }
                    pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                  } while (pMVar25 != pMVar33);
                }
                *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                     auVar119._0_4_;
                uVar30 = uVar30 + 1;
                pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
              } while (uVar30 != uVar28);
            }
            pMVar12 = (Mat *)((long)&pMVar12->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar12 != pMVar20);
        }
      }
    }
    else if (uVar10 == 2) {
      uVar10 = bottom_blob->w;
      pMVar25 = (Mat *)(ulong)uVar10;
      iVar14 = bottom_blob->h;
      pMVar20 = (Mat *)(long)iVar14;
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar45._0_8_ = SUB168(auVar44 ^ auVar107,0) << 0x3f;
      auVar45._8_8_ = SUB168(auVar44 ^ auVar107,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar45);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        if (iVar14 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
        pMVar33 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar8 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
          pMVar12 = (Mat *)0x0;
          if (iVar8 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
          pMVar19 = pMVar33;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar14 < 1) {
          fVar35 = 3.4028235e+38;
        }
        else {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar33 = (Mat *)0x0;
          do {
            fVar35 = 3.4028235e+38;
            if (0 < (int)uVar10) {
              pMVar19 = (Mat *)0x0;
              fVar35 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                if (fVar1 <= fVar35) {
                  fVar35 = fVar1;
                }
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar25 != pMVar19);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar33 * 4) = fVar35;
            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar33 != pMVar20);
          fVar35 = 3.4028235e+38;
          pMVar25 = (Mat *)0x0;
          do {
            fVar1 = *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            if (fVar1 <= fVar35) {
              fVar35 = fVar1;
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3a4;
          (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
          pMVar19 = pMVar12;
        }
      }
      else if (((bVar15 | (byte)iVar8 >> 1) & 1) == 0) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,iVar14,sVar2,opt->blob_allocator);
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = 3.4028235e+38;
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              fVar35 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                if (fVar1 <= fVar35) {
                  fVar35 = fVar1;
                }
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
      else if (((bVar16 | (byte)iVar8) & 1) == 0) {
        pMVar19 = pMVar25;
        Mat::create(top_blob,uVar10,1,sVar2,opt->blob_allocator);
        auVar69 = _DAT_0016f1f0;
        auVar76 = _DAT_0016e020;
        auVar107 = _DAT_0016e010;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar31 = top_blob->data;
          lVar23 = (ulong)uVar9 - 1;
          auVar46._8_4_ = (int)lVar23;
          auVar46._0_8_ = lVar23;
          auVar46._12_4_ = (int)((ulong)lVar23 >> 0x20);
          uVar28 = 0;
          auVar46 = auVar46 ^ _DAT_0016e020;
          do {
            auVar134._8_4_ = (int)uVar28;
            auVar134._0_8_ = uVar28;
            auVar134._12_4_ = (int)(uVar28 >> 0x20);
            auVar205 = (auVar134 | auVar107) ^ auVar76;
            iVar8 = auVar46._4_4_;
            iVar202 = auVar46._12_4_;
            if ((bool)(~(auVar205._4_4_ == iVar8 && auVar46._0_4_ < auVar205._0_4_ ||
                        iVar8 < auVar205._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x7f7fffff;
            }
            if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar46._8_4_) &&
                auVar205._12_4_ <= iVar202) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x7f7fffff;
            }
            auVar205 = (auVar134 | auVar69) ^ auVar76;
            auVar204._0_4_ = -(uint)(auVar46._0_4_ < auVar205._0_4_);
            auVar204._4_4_ = -(uint)(iVar8 < auVar205._4_4_);
            auVar204._8_4_ = -(uint)(auVar46._8_4_ < auVar205._8_4_);
            auVar204._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
            iVar8 = -(uint)(auVar205._4_4_ == iVar8);
            iVar202 = -(uint)(auVar205._12_4_ == iVar202);
            auVar220._4_4_ = iVar8;
            auVar220._0_4_ = iVar8;
            auVar220._8_4_ = iVar202;
            auVar220._12_4_ = iVar202;
            auVar135._4_4_ = auVar204._4_4_;
            auVar135._0_4_ = auVar204._4_4_;
            auVar135._8_4_ = auVar204._12_4_;
            auVar135._12_4_ = auVar204._12_4_;
            auVar136._8_4_ = 0xffffffff;
            auVar136._0_8_ = 0xffffffffffffffff;
            auVar136._12_4_ = 0xffffffff;
            auVar136 = (auVar135 | auVar220 & auVar204) ^ auVar136;
            if ((auVar136 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x7f7fffff;
            }
            pMVar19 = (Mat *)(ulong)auVar136._8_2_;
            if ((auVar136 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar28 = uVar28 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
        }
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                fVar35 = *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                if (fVar35 <= fVar1) {
                  fVar1 = fVar35;
                }
                *(float *)((long)pvVar26 + (long)pMVar12 * 4) = fVar1;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
    }
    else if (uVar10 == 1) {
      iVar14 = bottom_blob->w;
      pMVar19 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar14 < 1) {
LAB_0013965d:
        fVar35 = 3.4028235e+38;
      }
      else {
        fVar35 = 3.4028235e+38;
        lVar23 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar23 * 4);
          if (fVar1 <= fVar35) {
            fVar35 = fVar1;
          }
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
      }
LAB_00139665:
      *(float *)top_blob->data = fVar35;
    }
    break;
  case 6:
    fVar34 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar10 == 3) {
        uVar10 = bottom_blob->w;
        lVar23 = (long)(int)uVar10;
        uVar9 = bottom_blob->h;
        uVar28 = (ulong)uVar9;
        uVar22 = bottom_blob->c;
        pMVar20 = (Mat *)(long)(int)uVar22;
        uVar18 = uVar9 * uVar10;
        auVar73._8_4_ = 0xffffffff;
        auVar73._0_8_ = 0xffffffffffffffff;
        auVar73._12_4_ = 0xffffffff;
        auVar74._0_8_ = SUB168(auVar73 ^ auVar107,0) << 0x3f;
        auVar74._8_8_ = SUB168(auVar73 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(3,auVar74);
        bVar24 = reduce_c ^ 1;
        if (iVar14 == 0 && bVar24 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar22 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
          pMVar25 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar25;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar22 < 1) {
            fVar35 = 1.0;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar31 = bottom_blob->data;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = 1.0;
              if (0 < (int)uVar18) {
                uVar30 = 0;
                fVar35 = 1.0;
                do {
                  fVar35 = fVar35 * *(float *)((long)pvVar31 + uVar30 * 4);
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar19 != pMVar20);
            fVar35 = 1.0;
            pMVar25 = (Mat *)0x0;
            do {
              fVar35 = fVar35 * *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013dfc6;
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
        else if (iVar14 == 0 && reduce_c == false) {
          pMVar19 = (Mat *)(ulong)uVar22;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar26 = top_blob->data;
            pMVar25 = (Mat *)0x0;
            do {
              fVar35 = 1.0;
              if (0 < (int)uVar18) {
                pMVar19 = (Mat *)0x0;
                fVar35 = 1.0;
                do {
                  fVar35 = fVar35 * *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while ((Mat *)(ulong)uVar18 != pMVar19);
              }
              *(float *)((long)pvVar26 + (long)pMVar25 * 4) = fVar35;
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
              pMVar19 = (Mat *)(ulong)uVar18;
            } while (pMVar25 != pMVar20);
          }
        }
        else {
          pMVar25 = (Mat *)(ulong)uVar10;
          bVar21 = (byte)iVar14 >> 1 | bVar15;
          if (reduce_c != false || (bVar21 & 1) != 0) {
            if ((bVar21 & 1) == 0 && bVar24 == 0) {
              Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar9,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar87._8_4_ = (int)lVar17;
                    auVar87._0_8_ = lVar17;
                    auVar87._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar87 = auVar87 ^ _DAT_0016e020;
                    do {
                      auVar170._8_4_ = (int)pMVar19;
                      auVar170._0_8_ = pMVar19;
                      auVar170._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar170 | auVar107) ^ auVar76;
                      iVar14 = auVar87._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar87._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != auVar87._12_4_ || auVar205._8_4_ <= auVar87._8_4_) &&
                          auVar205._12_4_ <= auVar87._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar170 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar87._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x3f800000;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x3f800000;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        pvVar26 = pvVar31;
                        do {
                          auVar129 = ZEXT816(0x3f800000);
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            auVar129 = ZEXT816(0x3f800000);
                            do {
                              auVar129._0_4_ =
                                   auVar129._0_4_ * *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          *(int *)((long)ptr +
                                  uVar30 * 4 +
                                  CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                               auVar129._0_4_;
                          uVar30 = uVar30 + 1;
                          pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                        } while (uVar30 != uVar28);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar88._8_4_ = (int)lVar23;
                    auVar88._0_8_ = lVar23;
                    auVar88._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar30 = 0;
                    auVar88 = auVar88 ^ _DAT_0016e020;
                    do {
                      auVar171._8_4_ = (int)uVar30;
                      auVar171._0_8_ = uVar30;
                      auVar171._12_4_ = (int)(uVar30 >> 0x20);
                      auVar205 = (auVar171 | auVar107) ^ auVar76;
                      iVar14 = auVar88._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar88._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(int *)((long)&pMVar19->data + uVar30 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != auVar88._12_4_ || auVar205._8_4_ <= auVar88._8_4_) &&
                          auVar205._12_4_ <= auVar88._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar171 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar88._0_4_)) {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0x3f800000;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0x3f800000;
                      }
                      uVar30 = uVar30 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        do {
                          *(float *)((long)pvVar31 + uVar30 * 4) =
                               *(float *)((long)pvVar26 + uVar30 * 4) *
                               *(float *)((long)pvVar31 + uVar30 * 4);
                          uVar30 = uVar30 + 1;
                        } while (uVar28 != uVar30);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            else {
              bVar21 = (byte)iVar14 | bVar16;
              if ((bVar21 & 1) != 0 || bVar24 != 0) {
                if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                  Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar10 - 1;
                    auVar106._8_4_ = (int)lVar23;
                    auVar106._0_8_ = lVar23;
                    auVar106._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar106 = auVar106 ^ _DAT_0016e020;
                    do {
                      auVar199._8_4_ = (int)uVar28;
                      auVar199._0_8_ = uVar28;
                      auVar199._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar199 | auVar107) ^ auVar76;
                      iVar14 = auVar106._4_4_;
                      iVar8 = auVar106._12_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar106._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar106._8_4_) &&
                          auVar205._12_4_ <= iVar8) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar199 | auVar69) ^ auVar76;
                      auVar218._0_4_ = -(uint)(auVar106._0_4_ < auVar205._0_4_);
                      auVar218._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                      auVar218._8_4_ = -(uint)(auVar106._8_4_ < auVar205._8_4_);
                      auVar218._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                      iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                      iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                      auVar233._4_4_ = iVar14;
                      auVar233._0_4_ = iVar14;
                      auVar233._8_4_ = iVar8;
                      auVar233._12_4_ = iVar8;
                      auVar200._4_4_ = auVar218._4_4_;
                      auVar200._0_4_ = auVar218._4_4_;
                      auVar200._8_4_ = auVar218._12_4_;
                      auVar200._12_4_ = auVar218._12_4_;
                      auVar201._8_4_ = 0xffffffff;
                      auVar201._0_8_ = 0xffffffffffffffff;
                      auVar201._12_4_ = 0xffffffff;
                      auVar201 = (auVar200 | auVar233 & auVar218) ^ auVar201;
                      if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x3f800000;
                      }
                      pMVar25 = (Mat *)(ulong)auVar201._8_2_;
                      if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                  }
                  pMVar19 = pMVar25;
                  if (0 < (int)uVar22) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar31 = bottom_blob->data;
                    pvVar26 = top_blob->data;
                    pMVar25 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar18) {
                        pMVar19 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar26 + (long)pMVar19 * 4) =
                               *(float *)((long)pvVar31 + (long)pMVar19 * 4) *
                               *(float *)((long)pvVar26 + (long)pMVar19 * 4);
                          pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                        } while ((Mat *)(ulong)uVar18 != pMVar19);
                      }
                      pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                      pMVar19 = (Mat *)(ulong)uVar18;
                    } while (pMVar25 != pMVar20);
                  }
                }
                else {
                  pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                  if (reduce_c == false && (bVar21 & 1) == 0) {
                    pMVar19 = (Mat *)(ulong)uVar10;
                    Mat::create(top_blob,uVar10,uVar22,sVar2,opt->blob_allocator);
                    auVar69 = _DAT_0016f1f0;
                    auVar76 = _DAT_0016e020;
                    auVar107 = _DAT_0016e010;
                    uVar18 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar18) {
                      pvVar31 = top_blob->data;
                      lVar23 = (ulong)uVar18 - 1;
                      auVar75._8_4_ = (int)lVar23;
                      auVar75._0_8_ = lVar23;
                      auVar75._12_4_ = (int)((ulong)lVar23 >> 0x20);
                      uVar28 = 0;
                      auVar75 = auVar75 ^ _DAT_0016e020;
                      do {
                        auVar157._8_4_ = (int)uVar28;
                        auVar157._0_8_ = uVar28;
                        auVar157._12_4_ = (int)(uVar28 >> 0x20);
                        auVar205 = (auVar157 | auVar107) ^ auVar76;
                        iVar14 = auVar75._4_4_;
                        iVar8 = auVar75._12_4_;
                        if ((bool)(~(auVar205._4_4_ == iVar14 && auVar75._0_4_ < auVar205._0_4_ ||
                                    iVar14 < auVar205._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x3f800000;
                        }
                        if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar75._8_4_) &&
                            auVar205._12_4_ <= iVar8) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x3f800000;
                        }
                        auVar205 = (auVar157 | auVar69) ^ auVar76;
                        auVar212._0_4_ = -(uint)(auVar75._0_4_ < auVar205._0_4_);
                        auVar212._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                        auVar212._8_4_ = -(uint)(auVar75._8_4_ < auVar205._8_4_);
                        auVar212._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
                        iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                        iVar8 = -(uint)(auVar205._12_4_ == iVar8);
                        auVar227._4_4_ = iVar14;
                        auVar227._0_4_ = iVar14;
                        auVar227._8_4_ = iVar8;
                        auVar227._12_4_ = iVar8;
                        auVar158._4_4_ = auVar212._4_4_;
                        auVar158._0_4_ = auVar212._4_4_;
                        auVar158._8_4_ = auVar212._12_4_;
                        auVar158._12_4_ = auVar212._12_4_;
                        auVar159._8_4_ = 0xffffffff;
                        auVar159._0_8_ = 0xffffffffffffffff;
                        auVar159._12_4_ = 0xffffffff;
                        auVar159 = (auVar158 | auVar227 & auVar212) ^ auVar159;
                        if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x3f800000;
                        }
                        pMVar19 = (Mat *)(ulong)auVar159._8_2_;
                        if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x3f800000;
                        }
                        uVar28 = uVar28 + 4;
                      } while ((uVar18 + 3 & 0xfffffffc) != uVar28);
                    }
                    if (0 < (int)uVar22) {
                      pvVar31 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar26 = top_blob->data;
                      pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                      sVar3 = bottom_blob->cstep;
                      pMVar12 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar9) {
                          uVar22 = 0;
                          pvVar32 = pvVar31;
                          do {
                            if (0 < (int)uVar10) {
                              pMVar33 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar26 + (long)pMVar33 * 4) =
                                     *(float *)((long)pvVar32 + (long)pMVar33 * 4) *
                                     *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                                pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                              } while (pMVar25 != pMVar33);
                            }
                            uVar22 = uVar22 + 1;
                            pvVar32 = (void *)((long)pvVar32 + (long)(int)uVar10 * 4);
                          } while (uVar22 != uVar9);
                        }
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                        pvVar26 = (void *)((long)&pMVar19->data + (long)pvVar26);
                      } while (pMVar12 != pMVar20);
                    }
                  }
                }
                break;
              }
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              pMVar19 = (Mat *)(ulong)uVar10;
              Mat::create((Mat *)&ptr,uVar10,1,uVar22,sVar2,opt->workspace_allocator);
              auVar69 = _DAT_0016f1f0;
              auVar76 = _DAT_0016e020;
              auVar107 = _DAT_0016e010;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar19 != 0) {
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    lVar17 = (ulong)uVar18 - 1;
                    auVar99._8_4_ = (int)lVar17;
                    auVar99._0_8_ = lVar17;
                    auVar99._12_4_ = (int)((ulong)lVar17 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar99 = auVar99 ^ _DAT_0016e020;
                    do {
                      auVar182._8_4_ = (int)pMVar19;
                      auVar182._0_8_ = pMVar19;
                      auVar182._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar182 | auVar107) ^ auVar76;
                      iVar14 = auVar99._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar99._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != auVar99._12_4_ || auVar205._8_4_ <= auVar99._8_4_) &&
                          auVar205._12_4_ <= auVar99._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar182 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar99._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x3f800000;
                        *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x3f800000;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar18 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = bottom_blob->data;
                    pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar12 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar9) {
                        uVar18 = 0;
                        pvVar32 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              *(float *)((long)pvVar26 + (long)pMVar33 * 4) =
                                   *(float *)((long)pvVar32 + (long)pMVar33 * 4) *
                                   *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar18 = uVar18 + 1;
                          pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                        } while (uVar18 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                      pvVar26 = (void *)((long)pvVar26 +
                                        CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                    } while (pMVar12 != pMVar20);
                  }
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  uVar9 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar9) {
                    pMVar19 = (Mat *)top_blob->data;
                    lVar23 = (ulong)uVar9 - 1;
                    auVar100._8_4_ = (int)lVar23;
                    auVar100._0_8_ = lVar23;
                    auVar100._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    uVar28 = 0;
                    auVar100 = auVar100 ^ _DAT_0016e020;
                    do {
                      auVar183._8_4_ = (int)uVar28;
                      auVar183._0_8_ = uVar28;
                      auVar183._12_4_ = (int)(uVar28 >> 0x20);
                      auVar205 = (auVar183 | auVar107) ^ auVar76;
                      iVar14 = auVar100._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar100._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(int *)((long)&pMVar19->data + uVar28 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != auVar100._12_4_ || auVar205._8_4_ <= auVar100._8_4_)
                          && auVar205._12_4_ <= auVar100._12_4_) {
                        *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar183 | auVar69) ^ auVar76;
                      iVar8 = auVar205._4_4_;
                      if (iVar8 <= iVar14 && (iVar8 != iVar14 || auVar205._0_4_ <= auVar100._0_4_))
                      {
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0x3f800000;
                        *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0x3f800000;
                      }
                      uVar28 = uVar28 + 4;
                    } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                  }
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    pvVar26 = ptr;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar12 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar31 + (long)pMVar12 * 4) =
                               *(float *)((long)pvVar26 + (long)pMVar12 * 4) *
                               *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                        } while (pMVar25 != pMVar12);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar26 = (void *)((long)pvVar26 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar20);
                  }
                  iVar14 = 0;
                }
              }
            }
            goto LAB_0013ea05;
          }
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,uVar22,sVar2,opt->blob_allocator);
          if (0 < (int)uVar22) {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar26 = top_blob->data;
            pMVar19 = (Mat *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar12 = (Mat *)0x0;
            do {
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar32 = pvVar31;
                do {
                  auVar123 = ZEXT816(0x3f800000);
                  if (0 < (int)uVar10) {
                    pMVar33 = (Mat *)0x0;
                    auVar123 = ZEXT816(0x3f800000);
                    do {
                      auVar123._0_4_ =
                           auVar123._0_4_ * *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                      pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                    } while (pMVar25 != pMVar33);
                  }
                  *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                       auVar123._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                } while (uVar30 != uVar28);
              }
              pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar12 != pMVar20);
          }
        }
      }
      else if (uVar10 == 2) {
        uVar10 = bottom_blob->w;
        pMVar25 = (Mat *)(ulong)uVar10;
        uVar9 = bottom_blob->h;
        pMVar20 = (Mat *)(long)(int)uVar9;
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar67._0_8_ = SUB168(auVar66 ^ auVar107,0) << 0x3f;
        auVar67._8_8_ = SUB168(auVar66 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(uVar13,auVar67);
        if (iVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar9 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          piVar11 = (int *)(sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc);
          pMVar33 = (Mat *)(piVar11 + 1);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
            pMVar12 = (Mat *)ptr;
            if (iVar14 != 0) goto LAB_0013b727;
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar33;
          }
          *(undefined4 *)((long)&pMVar12->data + (long)piVar11) = 1;
          if ((int)uVar9 < 1) {
            fVar35 = 1.0;
          }
          else {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = 1.0;
              if (0 < (int)uVar10) {
                pMVar33 = (Mat *)0x0;
                fVar35 = 1.0;
                do {
                  fVar35 = fVar35 * *(float *)((long)pvVar31 + (long)pMVar33 * 4);
                  pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                } while (pMVar25 != pMVar33);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
            fVar35 = 1.0;
            pMVar25 = (Mat *)0x0;
            do {
              fVar35 = fVar35 * *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)top_blob->data = fVar35;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + (long)piVar11);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013dfc6;
            (**(code **)(*(long *)pAVar6 + 0x18))();
            pMVar19 = pMVar12;
          }
        }
        else if (((bVar15 | (byte)iVar14 >> 1) & 1) == 0) {
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              fVar35 = 1.0;
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                fVar35 = 1.0;
                do {
                  fVar35 = fVar35 * *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
        else if (((bVar16 | (byte)iVar14) & 1) == 0) {
          pMVar19 = pMVar25;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          auVar69 = _DAT_0016f1f0;
          auVar76 = _DAT_0016e020;
          auVar107 = _DAT_0016e010;
          uVar22 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar22) {
            pvVar31 = top_blob->data;
            lVar23 = (ulong)uVar22 - 1;
            auVar68._8_4_ = (int)lVar23;
            auVar68._0_8_ = lVar23;
            auVar68._12_4_ = (int)((ulong)lVar23 >> 0x20);
            uVar28 = 0;
            auVar68 = auVar68 ^ _DAT_0016e020;
            do {
              auVar151._8_4_ = (int)uVar28;
              auVar151._0_8_ = uVar28;
              auVar151._12_4_ = (int)(uVar28 >> 0x20);
              auVar205 = (auVar151 | auVar107) ^ auVar76;
              iVar14 = auVar68._4_4_;
              iVar8 = auVar68._12_4_;
              if ((bool)(~(auVar205._4_4_ == iVar14 && auVar68._0_4_ < auVar205._0_4_ ||
                          iVar14 < auVar205._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x3f800000;
              }
              if ((auVar205._12_4_ != iVar8 || auVar205._8_4_ <= auVar68._8_4_) &&
                  auVar205._12_4_ <= iVar8) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x3f800000;
              }
              auVar205 = (auVar151 | auVar69) ^ auVar76;
              auVar210._0_4_ = -(uint)(auVar68._0_4_ < auVar205._0_4_);
              auVar210._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
              auVar210._8_4_ = -(uint)(auVar68._8_4_ < auVar205._8_4_);
              auVar210._12_4_ = -(uint)(iVar8 < auVar205._12_4_);
              iVar14 = -(uint)(auVar205._4_4_ == iVar14);
              iVar8 = -(uint)(auVar205._12_4_ == iVar8);
              auVar225._4_4_ = iVar14;
              auVar225._0_4_ = iVar14;
              auVar225._8_4_ = iVar8;
              auVar225._12_4_ = iVar8;
              auVar152._4_4_ = auVar210._4_4_;
              auVar152._0_4_ = auVar210._4_4_;
              auVar152._8_4_ = auVar210._12_4_;
              auVar152._12_4_ = auVar210._12_4_;
              auVar153._8_4_ = 0xffffffff;
              auVar153._0_8_ = 0xffffffffffffffff;
              auVar153._12_4_ = 0xffffffff;
              auVar153 = (auVar152 | auVar225 & auVar210) ^ auVar153;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x3f800000;
              }
              pMVar19 = (Mat *)(ulong)auVar153._8_2_;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x3f800000;
              }
              uVar28 = uVar28 + 4;
            } while ((uVar22 + 3 & 0xfffffffc) != uVar28);
          }
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            pMVar19 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar12 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar26 + (long)pMVar12 * 4) =
                       *(float *)((long)pvVar31 + (long)pMVar12 * 4) *
                       *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                  pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                } while (pMVar25 != pMVar12);
              }
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (pMVar19 != pMVar20);
          }
        }
      }
      else if (uVar10 == 1) {
        iVar14 = bottom_blob->w;
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar14 < 1) goto LAB_00139877;
        fVar35 = 1.0;
        lVar23 = 0;
        do {
          fVar35 = fVar35 * *(float *)((long)bottom_blob->data + lVar23 * 4);
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
        goto LAB_0013987f;
      }
    }
    else if (uVar10 == 3) {
      uVar10 = bottom_blob->w;
      lVar23 = (long)(int)uVar10;
      uVar9 = bottom_blob->h;
      uVar28 = (ulong)uVar9;
      iVar8 = bottom_blob->c;
      pMVar20 = (Mat *)(long)iVar8;
      uVar22 = uVar9 * uVar10;
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar55._0_8_ = SUB168(auVar54 ^ auVar107,0) << 0x3f;
      auVar55._8_8_ = SUB168(auVar54 ^ auVar107,8) << 0x3f;
      iVar14 = movmskpd(3,auVar55);
      bVar24 = reduce_c ^ 1;
      if (iVar14 == 0 && bVar24 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        if (iVar8 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc;
        pMVar25 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
          pMVar12 = (Mat *)0x0;
          if (iVar14 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar25;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar8 < 1) {
          fVar35 = 1.0;
        }
        else {
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pvVar31 = bottom_blob->data;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = 1.0;
            if (0 < (int)uVar22) {
              uVar30 = 0;
              fVar35 = 1.0;
              do {
                fVar35 = fVar35 * *(float *)((long)pvVar31 + uVar30 * 4);
                uVar30 = uVar30 + 1;
              } while (uVar22 != uVar30);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar19 != pMVar20);
          fVar35 = 1.0;
          pMVar25 = (Mat *)0x0;
          do {
            fVar35 = fVar35 * *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) {
LAB_0013dfc6:
            free(pMVar12);
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            pMVar19 = pMVar12;
          }
        }
      }
      else if (iVar14 == 0 && reduce_c == false) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,1,iVar8,sVar2,opt->blob_allocator);
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar25 = (Mat *)0x0;
          do {
            fVar35 = 1.0;
            if (0 < (int)uVar22) {
              uVar28 = 0;
              fVar35 = 1.0;
              do {
                fVar35 = fVar35 * *(float *)((long)pvVar31 + uVar28 * 4);
                uVar28 = uVar28 + 1;
              } while (uVar22 != uVar28);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * (long)pMVar25) = fVar35;
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar25 != pMVar20);
        }
      }
      else {
        pMVar25 = (Mat *)(ulong)uVar10;
        bVar21 = (byte)iVar14 >> 1 | bVar15;
        if (reduce_c != false || (bVar21 & 1) != 0) {
          if ((bVar21 & 1) == 0 && bVar24 == 0) {
            Mat::create(top_blob,1,uVar9,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)0x1;
            Mat::create((Mat *)&ptr,1,uVar9,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar81._8_4_ = (int)lVar17;
                  auVar81._0_8_ = lVar17;
                  auVar81._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar81 = auVar81 ^ _DAT_0016e020;
                  do {
                    auVar164._8_4_ = (int)pMVar19;
                    auVar164._0_8_ = pMVar19;
                    auVar164._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar164 | auVar107) ^ auVar76;
                    iVar14 = auVar81._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar81._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x3f800000;
                    }
                    if ((auVar205._12_4_ != auVar81._12_4_ || auVar205._8_4_ <= auVar81._8_4_) &&
                        auVar205._12_4_ <= auVar81._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x3f800000;
                    }
                    auVar205 = (auVar164 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar81._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x3f800000;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x3f800000;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      pvVar26 = pvVar31;
                      do {
                        auVar126 = ZEXT816(0x3f800000);
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          auVar126 = ZEXT816(0x3f800000);
                          do {
                            auVar126._0_4_ =
                                 auVar126._0_4_ * *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        *(int *)((long)ptr +
                                uVar30 * 4 +
                                CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar12) =
                             auVar126._0_4_;
                        uVar30 = uVar30 + 1;
                        pvVar26 = (void *)((long)pvVar26 + lVar23 * 4);
                      } while (uVar30 != uVar28);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar82._8_4_ = (int)lVar23;
                  auVar82._0_8_ = lVar23;
                  auVar82._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar30 = 0;
                  auVar82 = auVar82 ^ _DAT_0016e020;
                  do {
                    auVar165._8_4_ = (int)uVar30;
                    auVar165._0_8_ = uVar30;
                    auVar165._12_4_ = (int)(uVar30 >> 0x20);
                    auVar205 = (auVar165 | auVar107) ^ auVar76;
                    iVar14 = auVar82._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar82._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(int *)((long)&pMVar19->data + uVar30 * 4) = 0x3f800000;
                    }
                    if ((auVar205._12_4_ != auVar82._12_4_ || auVar205._8_4_ <= auVar82._8_4_) &&
                        auVar205._12_4_ <= auVar82._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar30 * 4 + 4) = 0x3f800000;
                    }
                    auVar205 = (auVar165 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar82._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar30 * 4 + 4) = 0x3f800000;
                    }
                    uVar30 = uVar30 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar30);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar30 * 4) =
                             *(float *)((long)pvVar26 + uVar30 * 4) *
                             *(float *)((long)pvVar31 + uVar30 * 4);
                        uVar30 = uVar30 + 1;
                      } while (uVar28 != uVar30);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
          else {
            bVar21 = (byte)iVar14 | bVar16;
            if ((bVar21 & 1) != 0 || bVar24 != 0) {
              if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                Mat::create(top_blob,uVar10,uVar9,1,sVar2,opt->blob_allocator);
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  pvVar31 = top_blob->data;
                  lVar23 = (ulong)uVar10 - 1;
                  auVar103._8_4_ = (int)lVar23;
                  auVar103._0_8_ = lVar23;
                  auVar103._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar103 = auVar103 ^ _DAT_0016e020;
                  do {
                    auVar190._8_4_ = (int)uVar28;
                    auVar190._0_8_ = uVar28;
                    auVar190._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar190 | auVar107) ^ auVar76;
                    iVar14 = auVar103._4_4_;
                    iVar202 = auVar103._12_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar103._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x3f800000;
                    }
                    if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar103._8_4_) &&
                        auVar205._12_4_ <= iVar202) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x3f800000;
                    }
                    auVar205 = (auVar190 | auVar69) ^ auVar76;
                    auVar215._0_4_ = -(uint)(auVar103._0_4_ < auVar205._0_4_);
                    auVar215._4_4_ = -(uint)(iVar14 < auVar205._4_4_);
                    auVar215._8_4_ = -(uint)(auVar103._8_4_ < auVar205._8_4_);
                    auVar215._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
                    iVar14 = -(uint)(auVar205._4_4_ == iVar14);
                    iVar202 = -(uint)(auVar205._12_4_ == iVar202);
                    auVar230._4_4_ = iVar14;
                    auVar230._0_4_ = iVar14;
                    auVar230._8_4_ = iVar202;
                    auVar230._12_4_ = iVar202;
                    auVar191._4_4_ = auVar215._4_4_;
                    auVar191._0_4_ = auVar215._4_4_;
                    auVar191._8_4_ = auVar215._12_4_;
                    auVar191._12_4_ = auVar215._12_4_;
                    auVar192._8_4_ = 0xffffffff;
                    auVar192._0_8_ = 0xffffffffffffffff;
                    auVar192._12_4_ = 0xffffffff;
                    auVar192 = (auVar191 | auVar230 & auVar215) ^ auVar192;
                    if ((auVar192 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x3f800000;
                    }
                    pMVar25 = (Mat *)(ulong)auVar192._8_2_;
                    if ((auVar192 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar28);
                }
                pMVar19 = pMVar25;
                if (0 < iVar8) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar31 = bottom_blob->data;
                  pvVar26 = top_blob->data;
                  pMVar25 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar22) {
                      pMVar19 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar26 + (long)pMVar19 * 4) =
                             *(float *)((long)pvVar31 + (long)pMVar19 * 4) *
                             *(float *)((long)pvVar26 + (long)pMVar19 * 4);
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      } while ((Mat *)(ulong)uVar22 != pMVar19);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                    pMVar19 = (Mat *)(ulong)uVar22;
                  } while (pMVar25 != pMVar20);
                }
              }
              else {
                pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                if (reduce_c == false && (bVar21 & 1) == 0) {
                  pMVar19 = (Mat *)(ulong)uVar10;
                  Mat::create(top_blob,uVar10,1,iVar8,sVar2,opt->blob_allocator);
                  auVar69 = _DAT_0016f1f0;
                  auVar76 = _DAT_0016e020;
                  auVar107 = _DAT_0016e010;
                  sVar2 = top_blob->cstep;
                  uVar22 = top_blob->c * (int)sVar2;
                  if (0 < (int)uVar22) {
                    pvVar31 = top_blob->data;
                    lVar23 = (ulong)uVar22 - 1;
                    auVar56._8_4_ = (int)lVar23;
                    auVar56._0_8_ = lVar23;
                    auVar56._12_4_ = (int)((ulong)lVar23 >> 0x20);
                    pMVar19 = (Mat *)0x0;
                    auVar56 = auVar56 ^ _DAT_0016e020;
                    do {
                      auVar141._8_4_ = (int)pMVar19;
                      auVar141._0_8_ = pMVar19;
                      auVar141._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                      auVar205 = (auVar141 | auVar107) ^ auVar76;
                      iVar14 = auVar56._4_4_;
                      if ((bool)(~(auVar205._4_4_ == iVar14 && auVar56._0_4_ < auVar205._0_4_ ||
                                  iVar14 < auVar205._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4) = 0x3f800000;
                      }
                      if ((auVar205._12_4_ != auVar56._12_4_ || auVar205._8_4_ <= auVar56._8_4_) &&
                          auVar205._12_4_ <= auVar56._12_4_) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 4) = 0x3f800000;
                      }
                      auVar205 = (auVar141 | auVar69) ^ auVar76;
                      iVar202 = auVar205._4_4_;
                      if (iVar202 <= iVar14 &&
                          (iVar202 != iVar14 || auVar205._0_4_ <= auVar56._0_4_)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 8) = 0x3f800000;
                        *(undefined4 *)((long)pvVar31 + (long)pMVar19 * 4 + 0xc) = 0x3f800000;
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                    } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                  }
                  if (0 < iVar8) {
                    pvVar31 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    pMVar19 = (Mat *)top_blob->data;
                    sVar4 = bottom_blob->cstep;
                    sVar5 = top_blob->elemsize;
                    pMVar12 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar22 = 0;
                        pvVar26 = pvVar31;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar33 = (Mat *)0x0;
                            do {
                              *(float *)((long)&pMVar19->data + (long)pMVar33 * 4) =
                                   *(float *)((long)pvVar26 + (long)pMVar33 * 4) *
                                   *(float *)((long)&pMVar19->data + (long)pMVar33 * 4);
                              pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                            } while (pMVar25 != pMVar33);
                          }
                          uVar22 = uVar22 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
                        } while (uVar22 != uVar9);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar3 * sVar4);
                      pMVar19 = (Mat *)((long)&pMVar19->data + sVar2 * sVar5);
                    } while (pMVar12 != pMVar20);
                  }
                }
              }
              break;
            }
            Mat::create(top_blob,uVar10,1,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            pMVar19 = (Mat *)(ulong)uVar10;
            Mat::create((Mat *)&ptr,uVar10,1,iVar8,sVar2,opt->workspace_allocator);
            auVar69 = _DAT_0016f1f0;
            auVar76 = _DAT_0016e020;
            auVar107 = _DAT_0016e010;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              pMVar19 = (Mat *)(long)(int)local_68._4_4_;
              if (local_68._8_8_ * (long)pMVar19 != 0) {
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  lVar17 = (ulong)uVar22 - 1;
                  auVar93._8_4_ = (int)lVar17;
                  auVar93._0_8_ = lVar17;
                  auVar93._12_4_ = (int)((ulong)lVar17 >> 0x20);
                  pMVar19 = (Mat *)0x0;
                  auVar93 = auVar93 ^ _DAT_0016e020;
                  do {
                    auVar176._8_4_ = (int)pMVar19;
                    auVar176._0_8_ = pMVar19;
                    auVar176._12_4_ = (int)((ulong)pMVar19 >> 0x20);
                    auVar205 = (auVar176 | auVar107) ^ auVar76;
                    iVar14 = auVar93._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar93._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4) = 0x3f800000;
                    }
                    if ((auVar205._12_4_ != auVar93._12_4_ || auVar205._8_4_ <= auVar93._8_4_) &&
                        auVar205._12_4_ <= auVar93._12_4_) {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 4) = 0x3f800000;
                    }
                    auVar205 = (auVar176 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar93._0_4_))
                    {
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 8) = 0x3f800000;
                      *(undefined4 *)((long)ptr + (long)pMVar19 * 4 + 0xc) = 0x3f800000;
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 4);
                  } while ((Mat *)(ulong)(uVar22 + 3 & 0xfffffffc) != pMVar19);
                }
                if (0 < iVar8) {
                  pvVar31 = bottom_blob->data;
                  pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar12 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      pvVar32 = pvVar31;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar33 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar26 + (long)pMVar33 * 4) =
                                 *(float *)((long)pvVar32 + (long)pMVar33 * 4) *
                                 *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                            pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                          } while (pMVar25 != pMVar33);
                        }
                        uVar22 = uVar22 + 1;
                        pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
                      } while (uVar22 != uVar9);
                    }
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                    pvVar31 = (void *)((long)&pMVar19->data + (long)pvVar31);
                    pvVar26 = (void *)((long)pvVar26 +
                                      CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                  } while (pMVar12 != pMVar20);
                }
                auVar69 = _DAT_0016f1f0;
                auVar76 = _DAT_0016e020;
                auVar107 = _DAT_0016e010;
                uVar9 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar9) {
                  pMVar19 = (Mat *)top_blob->data;
                  lVar23 = (ulong)uVar9 - 1;
                  auVar94._8_4_ = (int)lVar23;
                  auVar94._0_8_ = lVar23;
                  auVar94._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  uVar28 = 0;
                  auVar94 = auVar94 ^ _DAT_0016e020;
                  do {
                    auVar177._8_4_ = (int)uVar28;
                    auVar177._0_8_ = uVar28;
                    auVar177._12_4_ = (int)(uVar28 >> 0x20);
                    auVar205 = (auVar177 | auVar107) ^ auVar76;
                    iVar14 = auVar94._4_4_;
                    if ((bool)(~(auVar205._4_4_ == iVar14 && auVar94._0_4_ < auVar205._0_4_ ||
                                iVar14 < auVar205._4_4_) & 1)) {
                      *(int *)((long)&pMVar19->data + uVar28 * 4) = 0x3f800000;
                    }
                    if ((auVar205._12_4_ != auVar94._12_4_ || auVar205._8_4_ <= auVar94._8_4_) &&
                        auVar205._12_4_ <= auVar94._12_4_) {
                      *(undefined4 *)((long)&pMVar19->data + uVar28 * 4 + 4) = 0x3f800000;
                    }
                    auVar205 = (auVar177 | auVar69) ^ auVar76;
                    iVar202 = auVar205._4_4_;
                    if (iVar202 <= iVar14 && (iVar202 != iVar14 || auVar205._0_4_ <= auVar94._0_4_))
                    {
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&pMVar19->refcount + uVar28 * 4 + 4) = 0x3f800000;
                    }
                    uVar28 = uVar28 + 4;
                  } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
                }
                if (0 < iVar8) {
                  pvVar31 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  pvVar26 = ptr;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar12 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar31 + (long)pMVar12 * 4) =
                             *(float *)((long)pvVar26 + (long)pMVar12 * 4) *
                             *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                        pMVar12 = (Mat *)((long)&pMVar12->data + 1);
                      } while (pMVar25 != pMVar12);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar26 = (void *)((long)pvVar26 +
                                      local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar20);
                }
                iVar14 = 0;
              }
            }
          }
LAB_0013ea05:
          Mat::~Mat((Mat *)&ptr);
          goto joined_r0x0013ea1c;
        }
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,uVar9,iVar8,sVar2,opt->blob_allocator);
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          pMVar19 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar12 = (Mat *)0x0;
          do {
            if (0 < (int)uVar9) {
              uVar30 = 0;
              pvVar32 = pvVar31;
              do {
                auVar120 = ZEXT816(0x3f800000);
                if (0 < (int)uVar10) {
                  pMVar33 = (Mat *)0x0;
                  auVar120 = ZEXT816(0x3f800000);
                  do {
                    auVar120._0_4_ = auVar120._0_4_ * *(float *)((long)pvVar32 + (long)pMVar33 * 4);
                    pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                  } while (pMVar25 != pMVar33);
                }
                *(int *)((long)pvVar26 + uVar30 * 4 + (long)pMVar19 * (long)pMVar12) =
                     auVar120._0_4_;
                uVar30 = uVar30 + 1;
                pvVar32 = (void *)((long)pvVar32 + lVar23 * 4);
              } while (uVar30 != uVar28);
            }
            pMVar12 = (Mat *)((long)&pMVar12->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar12 != pMVar20);
        }
      }
    }
    else if (uVar10 == 2) {
      uVar10 = bottom_blob->w;
      pMVar25 = (Mat *)(ulong)uVar10;
      iVar14 = bottom_blob->h;
      pMVar20 = (Mat *)(long)iVar14;
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar48._0_8_ = SUB168(auVar47 ^ auVar107,0) << 0x3f;
      auVar48._8_8_ = SUB168(auVar47 ^ auVar107,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar48);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        if (iVar14 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        piVar11 = (int *)(sVar2 * (long)pMVar20 + 3 & 0xfffffffffffffffc);
        pMVar33 = (Mat *)(piVar11 + 1);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar8 = posix_memalign(&ptr,0x10,(size_t)pMVar33);
          pMVar12 = (Mat *)ptr;
          if (iVar8 != 0) {
LAB_0013b727:
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            return -100;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar33;
        }
        *(undefined4 *)((long)&pMVar12->data + (long)piVar11) = 1;
        if (iVar14 < 1) {
          fVar35 = 1.0;
        }
        else {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = 1.0;
            if (0 < (int)uVar10) {
              pMVar33 = (Mat *)0x0;
              fVar35 = 1.0;
              do {
                fVar35 = fVar35 * *(float *)((long)pvVar31 + (long)pMVar33 * 4);
                pMVar33 = (Mat *)((long)&pMVar33->data + 1);
              } while (pMVar25 != pMVar33);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
          fVar35 = 1.0;
          pMVar25 = (Mat *)0x0;
          do {
            fVar35 = fVar35 * *(float *)((long)&pMVar12->data + (long)pMVar25 * 4);
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          } while (pMVar20 != pMVar25);
        }
        *(float *)top_blob->data = fVar35;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + (long)piVar11);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) goto LAB_0013dfc6;
          (**(code **)(*(long *)pAVar6 + 0x18))();
          pMVar19 = pMVar12;
        }
      }
      else if (((bVar15 | (byte)iVar8 >> 1) & 1) == 0) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,iVar14,sVar2,opt->blob_allocator);
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            fVar35 = 1.0;
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              fVar35 = 1.0;
              do {
                fVar35 = fVar35 * *(float *)((long)pvVar31 + (long)pMVar12 * 4);
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            *(float *)((long)pvVar26 + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
      else if (((bVar16 | (byte)iVar8) & 1) == 0) {
        pMVar19 = pMVar25;
        Mat::create(top_blob,uVar10,1,sVar2,opt->blob_allocator);
        auVar69 = _DAT_0016f1f0;
        auVar76 = _DAT_0016e020;
        auVar107 = _DAT_0016e010;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar31 = top_blob->data;
          lVar23 = (ulong)uVar9 - 1;
          auVar49._8_4_ = (int)lVar23;
          auVar49._0_8_ = lVar23;
          auVar49._12_4_ = (int)((ulong)lVar23 >> 0x20);
          uVar28 = 0;
          auVar49 = auVar49 ^ _DAT_0016e020;
          do {
            auVar137._8_4_ = (int)uVar28;
            auVar137._0_8_ = uVar28;
            auVar137._12_4_ = (int)(uVar28 >> 0x20);
            auVar205 = (auVar137 | auVar107) ^ auVar76;
            iVar8 = auVar49._4_4_;
            iVar202 = auVar49._12_4_;
            if ((bool)(~(auVar205._4_4_ == iVar8 && auVar49._0_4_ < auVar205._0_4_ ||
                        iVar8 < auVar205._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4) = 0x3f800000;
            }
            if ((auVar205._12_4_ != iVar202 || auVar205._8_4_ <= auVar49._8_4_) &&
                auVar205._12_4_ <= iVar202) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 4) = 0x3f800000;
            }
            auVar205 = (auVar137 | auVar69) ^ auVar76;
            auVar206._0_4_ = -(uint)(auVar49._0_4_ < auVar205._0_4_);
            auVar206._4_4_ = -(uint)(iVar8 < auVar205._4_4_);
            auVar206._8_4_ = -(uint)(auVar49._8_4_ < auVar205._8_4_);
            auVar206._12_4_ = -(uint)(iVar202 < auVar205._12_4_);
            iVar8 = -(uint)(auVar205._4_4_ == iVar8);
            iVar202 = -(uint)(auVar205._12_4_ == iVar202);
            auVar221._4_4_ = iVar8;
            auVar221._0_4_ = iVar8;
            auVar221._8_4_ = iVar202;
            auVar221._12_4_ = iVar202;
            auVar138._4_4_ = auVar206._4_4_;
            auVar138._0_4_ = auVar206._4_4_;
            auVar138._8_4_ = auVar206._12_4_;
            auVar138._12_4_ = auVar206._12_4_;
            auVar139._8_4_ = 0xffffffff;
            auVar139._0_8_ = 0xffffffffffffffff;
            auVar139._12_4_ = 0xffffffff;
            auVar139 = (auVar138 | auVar221 & auVar206) ^ auVar139;
            if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 8) = 0x3f800000;
            }
            pMVar19 = (Mat *)(ulong)auVar139._8_2_;
            if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar31 + uVar28 * 4 + 0xc) = 0x3f800000;
            }
            uVar28 = uVar28 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar28);
        }
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar19 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              pMVar12 = (Mat *)0x0;
              do {
                *(float *)((long)pvVar26 + (long)pMVar12 * 4) =
                     *(float *)((long)pvVar31 + (long)pMVar12 * 4) *
                     *(float *)((long)pvVar26 + (long)pMVar12 * 4);
                pMVar12 = (Mat *)((long)&pMVar12->data + 1);
              } while (pMVar25 != pMVar12);
            }
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (pMVar19 != pMVar20);
        }
      }
    }
    else if (uVar10 == 1) {
      iVar14 = bottom_blob->w;
      pMVar19 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar14 < 1) {
LAB_00139877:
        fVar35 = 1.0;
      }
      else {
        fVar35 = 1.0;
        lVar23 = 0;
        do {
          fVar35 = fVar35 * *(float *)((long)bottom_blob->data + lVar23 * 4);
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
      }
LAB_0013987f:
      *(float *)top_blob->data = fVar35;
    }
    break;
  case 7:
    post_process = (undefined1)this->keepdims;
    auVar111._0_8_ = lVar23 << 0x3f;
    auVar111._8_8_ = lVar17 << 0x3f;
    uVar13 = movmskpd(uVar10,auVar111);
    bVar16 = (byte)uVar13;
    fVar34 = 1.0;
LAB_0013746e:
    iVar14 = reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar34,(bool)(bVar16 >> 1),(bool)(bVar16 & 1),reduce_c,
                        (bool)post_process,0.0,(int)opt,in_stack_ffffffffffffff20);
    return iVar14;
  case 8:
    if (this->keepdims == 0) {
      auVar116._0_8_ = lVar23 << 0x3f;
      auVar116._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar116);
      iVar14 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    else {
      auVar113._0_8_ = lVar23 << 0x3f;
      auVar113._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar113);
      iVar14 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    if (iVar14 != 0) {
      return -100;
    }
    iVar14 = top_blob->dims;
    if (iVar14 != 3) {
      if (iVar14 == 2) {
        uVar10 = top_blob->h * top_blob->w;
        if (0 < (int)uVar10) {
          pvVar31 = top_blob->data;
          uVar28 = 0;
          do {
            *(float *)((long)pvVar31 + uVar28 * 4) = SQRT(*(float *)((long)pvVar31 + uVar28 * 4));
            uVar28 = uVar28 + 1;
          } while (uVar10 != uVar28);
          return 0;
        }
        return 0;
      }
      if (iVar14 != 1) {
        return 0;
      }
      iVar14 = top_blob->w;
      if (0 < (long)iVar14) {
        pvVar31 = top_blob->data;
        lVar23 = 0;
        do {
          *(float *)((long)pvVar31 + lVar23 * 4) = SQRT(*(float *)((long)pvVar31 + lVar23 * 4));
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
        return 0;
      }
      return 0;
    }
    uVar10 = top_blob->c;
    uVar9 = top_blob->h * top_blob->w;
    if ((ulong)uVar10 != 1) {
      if (0 < (int)uVar10) {
        pvVar31 = top_blob->data;
        sVar2 = top_blob->elemsize;
        sVar3 = top_blob->cstep;
        uVar28 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar30 = 0;
            do {
              *(float *)((long)pvVar31 + uVar30 * 4) = SQRT(*(float *)((long)pvVar31 + uVar30 * 4));
              uVar30 = uVar30 + 1;
            } while (uVar9 != uVar30);
          }
          uVar28 = uVar28 + 1;
          pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
        } while (uVar28 != uVar10);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar9) {
      pvVar31 = top_blob->data;
      uVar28 = 0;
      do {
        *(float *)((long)pvVar31 + uVar28 * 4) = SQRT(*(float *)((long)pvVar31 + uVar28 * 4));
        uVar28 = uVar28 + 1;
      } while (uVar9 != uVar28);
      return 0;
    }
    return 0;
  case 9:
    pMVar19 = top_blob;
    if (this->keepdims == 0) {
      auVar114._0_8_ = lVar23 << 0x3f;
      auVar114._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar114);
      iVar14 = reduction_op<std::plus<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
      fVar34 = extraout_XMM0_Da_00;
    }
    else {
      auVar109._0_8_ = lVar23 << 0x3f;
      auVar109._8_8_ = lVar17 << 0x3f;
      uVar13 = movmskpd(uVar10,auVar109);
      iVar14 = reduction_op_keepdims<std::plus<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar34,(bool)((byte)uVar13 >> 1),
                          (bool)((byte)uVar13 & 1),reduce_c,opt);
      fVar34 = extraout_XMM0_Da;
    }
    if (iVar14 != 0) {
      return -100;
    }
    goto LAB_001398cb;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar10 == 3) {
        uVar10 = bottom_blob->w;
        pMVar20 = (Mat *)(long)(int)uVar10;
        uVar9 = bottom_blob->h;
        uVar28 = (ulong)uVar9;
        uVar22 = bottom_blob->c;
        pMVar25 = (Mat *)(long)(int)uVar22;
        uVar18 = uVar9 * uVar10;
        auVar76._8_4_ = 0xffffffff;
        auVar76._0_8_ = 0xffffffffffffffff;
        auVar76._12_4_ = 0xffffffff;
        in_XMM0._0_8_ = SUB168(auVar76 ^ auVar107,0) << 0x3f;
        in_XMM0._8_8_ = SUB168(auVar76 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(3,in_XMM0);
        bVar24 = reduce_c ^ 1;
        if (iVar14 == 0 && bVar24 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar22 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * (long)pMVar25 + 3 & 0xfffffffffffffffc;
          pMVar20 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar20);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar20;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar22 < 1) {
            in_XMM0 = ZEXT816(0);
          }
          else {
            pvVar31 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pMVar20 = (Mat *)0x0;
            do {
              if ((int)uVar18 < 1) {
                fVar34 = 0.0;
              }
              else {
                fVar34 = 0.0;
                uVar30 = 0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar31 + uVar30 * 4));
                  fVar34 = fVar34 + fVar35;
                  uVar30 = uVar30 + 1;
                } while (uVar18 != uVar30);
              }
              *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar34;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar20 != pMVar25);
            in_XMM0 = ZEXT816(0);
            pMVar20 = (Mat *)0x0;
            do {
              in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)&pMVar12->data + (long)pMVar20 * 4);
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            } while (pMVar25 != pMVar20);
          }
          *(int *)top_blob->data = in_XMM0._0_4_;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3b9;
            in_XMM0._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))();
            in_XMM0._8_8_ = extraout_XMM0_Qb_02;
            pMVar19 = pMVar12;
          }
        }
        else if (iVar14 == 0 && reduce_c == false) {
          pMVar19 = (Mat *)(ulong)uVar22;
          Mat::create(top_blob,uVar22,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_10;
          if (0 < (int)uVar22) {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar31 = bottom_blob->data;
            pvVar26 = top_blob->data;
            pMVar20 = (Mat *)0x0;
            do {
              if ((int)uVar18 < 1) {
                in_XMM0 = ZEXT816(0);
              }
              else {
                in_XMM0 = ZEXT816(0);
                uVar28 = 0;
                do {
                  fVar34 = expf(*(float *)((long)pvVar31 + uVar28 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                  uVar28 = uVar28 + 1;
                } while (uVar18 != uVar28);
              }
              *(int *)((long)pvVar26 + (long)pMVar20 * 4) = in_XMM0._0_4_;
              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
              pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
            } while (pMVar20 != pMVar25);
          }
        }
        else {
          pMVar12 = (Mat *)(ulong)uVar10;
          bVar21 = (byte)iVar14 >> 1 | bVar15;
          if (reduce_c != false || (bVar21 & 1) != 0) {
            if ((bVar21 & 1) == 0 && bVar24 == 0) {
              Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = ZEXT816(0);
              local_68 = ZEXT816(0);
              pMVar19 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar9,uVar22,sVar2,opt->workspace_allocator);
              pvVar31 = ptr;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                  local_48 = local_68._8_8_;
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    memset(ptr,0,(ulong)uVar18 << 2);
                  }
                  if (0 < (int)uVar22) {
                    local_a8 = bottom_blob->data;
                    local_50 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    local_58 = (Mat *)(CONCAT44(uStack_84,uStack_88) * local_48);
                    local_c0 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        lVar23 = (long)local_58 * (long)local_c0;
                        uVar30 = 0;
                        pvVar26 = local_a8;
                        do {
                          if ((int)uVar10 < 1) {
                            fVar34 = 0.0;
                          }
                          else {
                            fVar34 = 0.0;
                            pMVar19 = (Mat *)0x0;
                            do {
                              fVar35 = expf(*(float *)((long)pvVar26 + (long)pMVar19 * 4));
                              fVar34 = fVar34 + fVar35;
                              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                            } while (pMVar12 != pMVar19);
                          }
                          *(float *)((long)pvVar31 + uVar30 * 4 + lVar23) = fVar34;
                          uVar30 = uVar30 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)pMVar20 * 4);
                        } while (uVar30 != uVar28);
                      }
                      local_c0 = (Mat *)((long)&local_c0->data + 1);
                      local_a8 = (void *)((long)&local_50->data + (long)local_a8);
                    } while (local_c0 != pMVar25);
                  }
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar10) {
                    memset(top_blob->data,0,(ulong)uVar10 << 2);
                  }
                  if (0 < (int)uVar22) {
                    pvVar26 = top_blob->data;
                    pMVar19 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar30 = 0;
                        do {
                          *(float *)((long)pvVar26 + uVar30 * 4) =
                               *(float *)((long)pvVar31 + uVar30 * 4) +
                               *(float *)((long)pvVar26 + uVar30 * 4);
                          uVar30 = uVar30 + 1;
                        } while (uVar28 != uVar30);
                      }
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + local_48 * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar19 != pMVar25);
                  }
                  iVar14 = 0;
                  pMVar19 = pMVar25;
                }
              }
            }
            else {
              bVar21 = (byte)iVar14 | bVar16;
              if ((bVar21 & 1) != 0 || bVar24 != 0) {
                if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                  Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
                  uVar10 = top_blob->c * (int)top_blob->cstep;
                  pMVar19 = pMVar12;
                  in_XMM0 = extraout_XMM0_17;
                  if (0 < (int)uVar10) {
                    pMVar19 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar10 << 2);
                    in_XMM0 = extraout_XMM0_18;
                  }
                  if (0 < (int)uVar22) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar31 = bottom_blob->data;
                    pvVar26 = top_blob->data;
                    pMVar20 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar18) {
                        uVar28 = 0;
                        do {
                          fVar34 = expf(*(float *)((long)pvVar31 + uVar28 * 4));
                          in_XMM0._0_4_ = fVar34 + *(float *)((long)pvVar26 + uVar28 * 4);
                          in_XMM0._4_12_ = extraout_var_04;
                          *(float *)((long)pvVar26 + uVar28 * 4) = in_XMM0._0_4_;
                          uVar28 = uVar28 + 1;
                        } while (uVar18 != uVar28);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                    } while (pMVar20 != pMVar25);
                  }
                }
                else {
                  pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                  if (reduce_c == false && (bVar21 & 1) == 0) {
                    pMVar19 = (Mat *)(ulong)uVar10;
                    Mat::create(top_blob,uVar10,uVar22,sVar2,opt->blob_allocator);
                    uVar18 = top_blob->c * (int)top_blob->cstep;
                    in_XMM0 = extraout_XMM0_05;
                    if (0 < (int)uVar18) {
                      pMVar19 = (Mat *)0x0;
                      memset(top_blob->data,0,(ulong)uVar18 << 2);
                      in_XMM0 = extraout_XMM0_06;
                    }
                    if (0 < (int)uVar22) {
                      local_b8 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar31 = top_blob->data;
                      pMVar20 = (Mat *)((long)top_blob->w * top_blob->elemsize);
                      sVar3 = bottom_blob->cstep;
                      local_d8 = (Mat *)0x0;
                      pMVar19 = pMVar20;
                      do {
                        if (0 < (int)uVar9) {
                          uVar22 = 0;
                          pvVar26 = local_b8;
                          do {
                            if (0 < (int)uVar10) {
                              pMVar33 = (Mat *)0x0;
                              do {
                                fVar34 = expf(*(float *)((long)pvVar26 + (long)pMVar33 * 4));
                                in_XMM0._0_4_ =
                                     fVar34 + *(float *)((long)pvVar31 + (long)pMVar33 * 4);
                                in_XMM0._4_12_ = extraout_var_02;
                                *(float *)((long)pvVar31 + (long)pMVar33 * 4) = in_XMM0._0_4_;
                                pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                              } while (pMVar12 != pMVar33);
                            }
                            uVar22 = uVar22 + 1;
                            pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
                          } while (uVar22 != uVar9);
                        }
                        local_d8 = (Mat *)((long)&local_d8->data + 1);
                        local_b8 = (void *)((long)local_b8 + sVar2 * sVar3);
                        pvVar31 = (void *)((long)&pMVar20->data + (long)pvVar31);
                      } while (local_d8 != pMVar25);
                    }
                  }
                }
                goto LAB_001398c6;
              }
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = ZEXT816(0);
              local_68 = ZEXT816(0);
              pMVar19 = pMVar20;
              Mat::create((Mat *)&ptr,uVar10,1,uVar22,sVar2,opt->workspace_allocator);
              pvVar31 = ptr;
              iVar14 = -100;
              if (ptr != (void *)0x0) {
                pMVar19 = (Mat *)local_68._8_8_;
                if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                  local_58 = (Mat *)local_68._8_8_;
                  uVar18 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar18) {
                    pMVar19 = (Mat *)0x0;
                    memset(ptr,0,(ulong)uVar18 << 2);
                  }
                  if (0 < (int)uVar22) {
                    local_c0 = (Mat *)bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    local_50 = (Mat *)(CONCAT44(uStack_84,uStack_88) * (long)local_58);
                    local_d8 = (Mat *)0x0;
                    pvVar26 = pvVar31;
                    do {
                      if (0 < (int)uVar9) {
                        uVar18 = 0;
                        pMVar33 = local_c0;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar27 = (Mat *)0x0;
                            do {
                              fVar34 = expf(*(float *)((long)pMVar33 + (long)pMVar27 * 4));
                              *(float *)((long)pvVar26 + (long)pMVar27 * 4) =
                                   fVar34 + *(float *)((long)pvVar26 + (long)pMVar27 * 4);
                              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                            } while (pMVar12 != pMVar27);
                          }
                          uVar18 = uVar18 + 1;
                          pMVar33 = (Mat *)((long)pMVar33 + (long)pMVar20 * 4);
                        } while (uVar18 != uVar9);
                      }
                      local_d8 = (Mat *)((long)&local_d8->data + 1);
                      local_c0 = (Mat *)((long)local_c0 + sVar2 * sVar3);
                      pvVar26 = (void *)((long)pvVar26 + (long)local_50);
                    } while (local_d8 != pMVar25);
                  }
                  uVar9 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar9) {
                    pMVar19 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar9 << 2);
                  }
                  if (0 < (int)uVar22) {
                    pvVar26 = top_blob->data;
                    pMVar20 = (Mat *)0x0;
                    pMVar19 = (Mat *)pvVar31;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar33 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar26 + (long)pMVar33 * 4) =
                               *(float *)((long)&pMVar19->data + (long)pMVar33 * 4) +
                               *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                          pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                        } while (pMVar12 != pMVar33);
                      }
                      pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                      pMVar19 = (Mat *)((long)&pMVar19->data +
                                       (long)local_58 * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar20 != pMVar25);
                  }
                  iVar14 = 0;
                }
              }
            }
            goto LAB_0013ebf7;
          }
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,uVar22,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_12;
          if (0 < (int)uVar22) {
            local_a8 = bottom_blob->data;
            pMVar33 = (Mat *)((long)top_blob->w * top_blob->elemsize);
            local_50 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
            local_58 = (Mat *)top_blob->data;
            local_c0 = (Mat *)0x0;
            pMVar19 = pMVar33;
            do {
              pMVar27 = local_58;
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar31 = local_a8;
                do {
                  if ((int)uVar10 < 1) {
                    in_XMM0 = ZEXT816(0);
                  }
                  else {
                    in_XMM0 = ZEXT816(0);
                    pMVar29 = (Mat *)0x0;
                    do {
                      fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar29 * 4));
                      in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    } while (pMVar12 != pMVar29);
                  }
                  *(int *)((long)&pMVar27->data + uVar30 * 4 + (long)pMVar33 * (long)local_c0) =
                       in_XMM0._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar31 = (void *)((long)pvVar31 + (long)pMVar20 * 4);
                } while (uVar30 != uVar28);
              }
              local_c0 = (Mat *)((long)&local_c0->data + 1);
              local_a8 = (void *)((long)&local_50->data + (long)local_a8);
            } while (local_c0 != pMVar25);
          }
        }
      }
      else if (uVar10 == 2) {
        uVar10 = bottom_blob->w;
        pMVar20 = (Mat *)(ulong)uVar10;
        uVar9 = bottom_blob->h;
        lVar23 = (long)(int)uVar9;
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        in_XMM0._0_8_ = SUB168(auVar69 ^ auVar107,0) << 0x3f;
        in_XMM0._8_8_ = SUB168(auVar69 ^ auVar107,8) << 0x3f;
        iVar14 = movmskpd(uVar13,in_XMM0);
        if (iVar14 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          if (uVar9 == 0) {
            return -100;
          }
          pAVar6 = opt->workspace_allocator;
          uVar28 = sVar2 * lVar23 + 3 & 0xfffffffffffffffc;
          pMVar25 = (Mat *)(uVar28 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar19 = (Mat *)0x10;
            iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
            pMVar12 = (Mat *)0x0;
            if (iVar14 == 0) {
              pMVar12 = (Mat *)ptr;
            }
          }
          else {
            pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar19 = pMVar25;
          }
          *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
          if ((int)uVar9 < 1) {
            in_XMM0 = ZEXT816(0);
          }
          else {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            lVar17 = 0;
            do {
              fVar34 = 0.0;
              if (0 < (int)uVar10) {
                pMVar25 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                  fVar34 = fVar34 + fVar35;
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar20 != pMVar25);
              }
              *(float *)((long)&pMVar12->data + lVar17 * 4) = fVar34;
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (lVar17 != lVar23);
            in_XMM0 = ZEXT816(0);
            lVar17 = 0;
            do {
              in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)&pMVar12->data + lVar17 * 4);
              lVar17 = lVar17 + 1;
            } while (lVar23 != lVar17);
          }
          *(int *)top_blob->data = in_XMM0._0_4_;
          LOCK();
          piVar11 = (int *)((long)&pMVar12->data + uVar28);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3b9;
            in_XMM0._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))();
            in_XMM0._8_8_ = extraout_XMM0_Qb_01;
            pMVar19 = pMVar12;
          }
        }
        else if (((bVar15 | (byte)iVar14 >> 1) & 1) == 0) {
          pMVar19 = (Mat *)(ulong)uVar9;
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_09;
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            lVar17 = 0;
            do {
              in_XMM0 = ZEXT816(0);
              if (0 < (int)uVar10) {
                pMVar25 = (Mat *)0x0;
                do {
                  fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar20 != pMVar25);
              }
              *(int *)((long)pvVar26 + lVar17 * 4) = in_XMM0._0_4_;
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (lVar17 != lVar23);
          }
        }
        else if (((bVar16 | (byte)iVar14) & 1) == 0) {
          pMVar19 = pMVar20;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          uVar22 = top_blob->c * (int)top_blob->cstep;
          in_XMM0 = extraout_XMM0_03;
          if (0 < (int)uVar22) {
            pMVar19 = (Mat *)0x0;
            memset(top_blob->data,0,(ulong)uVar22 << 2);
            in_XMM0 = extraout_XMM0_04;
          }
          if (0 < (int)uVar9) {
            pvVar31 = bottom_blob->data;
            iVar14 = bottom_blob->w;
            pvVar26 = top_blob->data;
            sVar2 = bottom_blob->elemsize;
            lVar17 = 0;
            do {
              if (0 < (int)uVar10) {
                pMVar25 = (Mat *)0x0;
                do {
                  fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                  in_XMM0._0_4_ = fVar34 + *(float *)((long)pvVar26 + (long)pMVar25 * 4);
                  in_XMM0._4_12_ = extraout_var_01;
                  *(float *)((long)pvVar26 + (long)pMVar25 * 4) = in_XMM0._0_4_;
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar20 != pMVar25);
              }
              lVar17 = lVar17 + 1;
              pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
            } while (lVar17 != lVar23);
          }
        }
      }
      else if (uVar10 == 1) {
        iVar14 = bottom_blob->w;
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar14 < 1) goto LAB_001398b6;
        pvVar31 = bottom_blob->data;
        in_XMM0 = (undefined1  [16])0x0;
        lVar23 = 0;
        do {
          fVar34 = expf(*(float *)((long)pvVar31 + lVar23 * 4));
          in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
        goto LAB_001398ba;
      }
    }
    else if (uVar10 == 3) {
      uVar10 = bottom_blob->w;
      pMVar20 = (Mat *)(long)(int)uVar10;
      uVar9 = bottom_blob->h;
      uVar28 = (ulong)uVar9;
      iVar8 = bottom_blob->c;
      pMVar25 = (Mat *)(long)iVar8;
      uVar22 = uVar9 * uVar10;
      auVar205._8_4_ = 0xffffffff;
      auVar205._0_8_ = 0xffffffffffffffff;
      auVar205._12_4_ = 0xffffffff;
      in_XMM0._0_8_ = SUB168(auVar205 ^ auVar107,0) << 0x3f;
      in_XMM0._8_8_ = SUB168(auVar205 ^ auVar107,8) << 0x3f;
      iVar14 = movmskpd(3,in_XMM0);
      bVar24 = reduce_c ^ 1;
      if (iVar14 == 0 && bVar24 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        if (iVar8 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * (long)pMVar25 + 3 & 0xfffffffffffffffc;
        pMVar20 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar14 = posix_memalign(&ptr,0x10,(size_t)pMVar20);
          pMVar12 = (Mat *)0x0;
          if (iVar14 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar20;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar8 < 1) {
          in_XMM0 = ZEXT816(0);
        }
        else {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pMVar20 = (Mat *)0x0;
          do {
            if ((int)uVar22 < 1) {
              fVar34 = 0.0;
            }
            else {
              fVar34 = 0.0;
              uVar30 = 0;
              do {
                fVar35 = expf(*(float *)((long)pvVar31 + uVar30 * 4));
                fVar34 = fVar34 + fVar35;
                uVar30 = uVar30 + 1;
              } while (uVar22 != uVar30);
            }
            *(float *)((long)&pMVar12->data + (long)pMVar20 * 4) = fVar34;
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
          } while (pMVar20 != pMVar25);
          in_XMM0 = ZEXT816(0);
          pMVar20 = (Mat *)0x0;
          do {
            in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)&pMVar12->data + (long)pMVar20 * 4);
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          } while (pMVar25 != pMVar20);
        }
        *(int *)top_blob->data = in_XMM0._0_4_;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) {
LAB_0013d3b9:
            free(pMVar12);
            in_XMM0 = extraout_XMM0_13;
          }
          else {
            in_XMM0._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))();
            in_XMM0._8_8_ = extraout_XMM0_Qb_00;
            pMVar19 = pMVar12;
          }
        }
      }
      else if (iVar14 == 0 && reduce_c == false) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,1,iVar8,sVar2,opt->blob_allocator);
        in_XMM0 = extraout_XMM0_08;
        if (0 < iVar8) {
          pvVar31 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar26 = top_blob->data;
          sVar3 = top_blob->elemsize;
          sVar4 = top_blob->cstep;
          sVar5 = bottom_blob->cstep;
          pMVar20 = (Mat *)0x0;
          do {
            if ((int)uVar22 < 1) {
              in_XMM0 = ZEXT816(0);
            }
            else {
              in_XMM0 = ZEXT816(0);
              uVar28 = 0;
              do {
                fVar34 = expf(*(float *)((long)pvVar31 + uVar28 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                uVar28 = uVar28 + 1;
              } while (uVar22 != uVar28);
            }
            *(int *)((long)pvVar26 + sVar3 * sVar4 * (long)pMVar20) = in_XMM0._0_4_;
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar5);
          } while (pMVar20 != pMVar25);
        }
      }
      else {
        pMVar12 = (Mat *)(ulong)uVar10;
        bVar21 = (byte)iVar14 >> 1 | bVar15;
        if (reduce_c == false && (bVar21 & 1) == 0) {
          pMVar19 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar9,iVar8,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_11;
          if (0 < iVar8) {
            local_a8 = bottom_blob->data;
            sVar2 = top_blob->elemsize;
            sVar3 = top_blob->cstep;
            pMVar19 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
            local_58 = (Mat *)top_blob->data;
            local_c0 = (Mat *)0x0;
            local_50 = pMVar19;
            do {
              pMVar33 = local_58;
              if (0 < (int)uVar9) {
                uVar30 = 0;
                pvVar31 = local_a8;
                do {
                  if ((int)uVar10 < 1) {
                    in_XMM0 = ZEXT816(0);
                  }
                  else {
                    in_XMM0 = ZEXT816(0);
                    pMVar27 = (Mat *)0x0;
                    do {
                      fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar27 * 4));
                      in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                      pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                    } while (pMVar12 != pMVar27);
                  }
                  *(int *)((long)&pMVar33->data + uVar30 * 4 + sVar2 * sVar3 * (long)local_c0) =
                       in_XMM0._0_4_;
                  uVar30 = uVar30 + 1;
                  pvVar31 = (void *)((long)pvVar31 + (long)pMVar20 * 4);
                } while (uVar30 != uVar28);
              }
              local_c0 = (Mat *)((long)&local_c0->data + 1);
              local_a8 = (void *)((long)&local_50->data + (long)local_a8);
            } while (local_c0 != pMVar25);
          }
        }
        else {
          if ((bVar21 & 1) == 0 && bVar24 == 0) {
            Mat::create(top_blob,1,uVar9,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = ZEXT816(0);
            local_68 = ZEXT816(0);
            pMVar19 = (Mat *)0x1;
            Mat::create((Mat *)&ptr,1,uVar9,iVar8,sVar2,opt->workspace_allocator);
            pvVar31 = ptr;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                local_48 = local_68._8_8_;
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  memset(ptr,0,(ulong)uVar22 << 2);
                }
                if (0 < iVar8) {
                  local_a8 = bottom_blob->data;
                  local_50 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  local_58 = (Mat *)(CONCAT44(uStack_84,uStack_88) * local_48);
                  local_c0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      lVar23 = (long)local_58 * (long)local_c0;
                      uVar30 = 0;
                      pvVar26 = local_a8;
                      do {
                        if ((int)uVar10 < 1) {
                          fVar34 = 0.0;
                        }
                        else {
                          fVar34 = 0.0;
                          pMVar19 = (Mat *)0x0;
                          do {
                            fVar35 = expf(*(float *)((long)pvVar26 + (long)pMVar19 * 4));
                            fVar34 = fVar34 + fVar35;
                            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                          } while (pMVar12 != pMVar19);
                        }
                        *(float *)((long)pvVar31 + uVar30 * 4 + lVar23) = fVar34;
                        uVar30 = uVar30 + 1;
                        pvVar26 = (void *)((long)pvVar26 + (long)pMVar20 * 4);
                      } while (uVar30 != uVar28);
                    }
                    local_c0 = (Mat *)((long)&local_c0->data + 1);
                    local_a8 = (void *)((long)&local_50->data + (long)local_a8);
                  } while (local_c0 != pMVar25);
                }
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  memset(top_blob->data,0,(ulong)uVar10 << 2);
                }
                if (0 < iVar8) {
                  pvVar26 = top_blob->data;
                  pMVar19 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar9) {
                      uVar30 = 0;
                      do {
                        *(float *)((long)pvVar26 + uVar30 * 4) =
                             *(float *)((long)pvVar31 + uVar30 * 4) +
                             *(float *)((long)pvVar26 + uVar30 * 4);
                        uVar30 = uVar30 + 1;
                      } while (uVar28 != uVar30);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar31 = (void *)((long)pvVar31 + local_48 * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar19 != pMVar25);
                }
                iVar14 = 0;
                pMVar19 = pMVar25;
              }
            }
          }
          else {
            bVar21 = (byte)iVar14 | bVar16;
            if ((bVar21 & 1) != 0 || bVar24 != 0) {
              if (((bVar15 | bVar16) & 1) == 0 && bVar24 == 0) {
                Mat::create(top_blob,uVar10,uVar9,1,sVar2,opt->blob_allocator);
                uVar10 = top_blob->c * (int)top_blob->cstep;
                pMVar19 = pMVar12;
                in_XMM0 = extraout_XMM0_15;
                if (0 < (int)uVar10) {
                  pMVar19 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar10 << 2);
                  in_XMM0 = extraout_XMM0_16;
                }
                if (0 < iVar8) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar31 = bottom_blob->data;
                  pvVar26 = top_blob->data;
                  pMVar20 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar22) {
                      uVar28 = 0;
                      do {
                        fVar34 = expf(*(float *)((long)pvVar31 + uVar28 * 4));
                        in_XMM0._0_4_ = fVar34 + *(float *)((long)pvVar26 + uVar28 * 4);
                        in_XMM0._4_12_ = extraout_var_03;
                        *(float *)((long)pvVar26 + uVar28 * 4) = in_XMM0._0_4_;
                        uVar28 = uVar28 + 1;
                      } while (uVar22 != uVar28);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                  } while (pMVar20 != pMVar25);
                }
              }
              else {
                pMVar19 = (Mat *)(ulong)CONCAT31(uVar7,bVar15 | bVar16 | bVar24);
                if (reduce_c == false && (bVar21 & 1) == 0) {
                  pMVar19 = (Mat *)(ulong)uVar10;
                  Mat::create(top_blob,uVar10,1,iVar8,sVar2,opt->blob_allocator);
                  sVar2 = top_blob->cstep;
                  uVar22 = top_blob->c * (int)sVar2;
                  in_XMM0 = extraout_XMM0_01;
                  if (0 < (int)uVar22) {
                    pMVar19 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar22 << 2);
                    in_XMM0 = extraout_XMM0_02;
                  }
                  if (0 < iVar8) {
                    local_b8 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    pvVar31 = top_blob->data;
                    sVar4 = bottom_blob->cstep;
                    sVar5 = top_blob->elemsize;
                    local_d8 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar9) {
                        uVar22 = 0;
                        pvVar26 = local_b8;
                        do {
                          if (0 < (int)uVar10) {
                            pMVar20 = (Mat *)0x0;
                            do {
                              fVar34 = expf(*(float *)((long)pvVar26 + (long)pMVar20 * 4));
                              in_XMM0._0_4_ = fVar34 + *(float *)((long)pvVar31 + (long)pMVar20 * 4)
                              ;
                              in_XMM0._4_12_ = extraout_var_00;
                              *(float *)((long)pvVar31 + (long)pMVar20 * 4) = in_XMM0._0_4_;
                              pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                            } while (pMVar12 != pMVar20);
                          }
                          uVar22 = uVar22 + 1;
                          pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
                        } while (uVar22 != uVar9);
                      }
                      local_d8 = (Mat *)((long)&local_d8->data + 1);
                      local_b8 = (void *)((long)local_b8 + sVar3 * sVar4);
                      pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar5);
                    } while (local_d8 != pMVar25);
                  }
                }
              }
              goto LAB_001398c6;
            }
            Mat::create(top_blob,uVar10,1,1,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = ZEXT816(0);
            local_68 = ZEXT816(0);
            pMVar19 = pMVar20;
            Mat::create((Mat *)&ptr,uVar10,1,iVar8,sVar2,opt->workspace_allocator);
            pvVar31 = ptr;
            iVar14 = -100;
            if (ptr != (void *)0x0) {
              if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                local_58 = (Mat *)local_68._8_8_;
                uVar22 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar22) {
                  pMVar19 = (Mat *)0x0;
                  memset(ptr,0,(ulong)uVar22 << 2);
                }
                if (0 < iVar8) {
                  local_c0 = (Mat *)bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  local_50 = (Mat *)(CONCAT44(uStack_84,uStack_88) * (long)local_58);
                  local_d8 = (Mat *)0x0;
                  pvVar26 = pvVar31;
                  do {
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      pMVar33 = local_c0;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            fVar34 = expf(*(float *)((long)pMVar33 + (long)pMVar27 * 4));
                            *(float *)((long)pvVar26 + (long)pMVar27 * 4) =
                                 fVar34 + *(float *)((long)pvVar26 + (long)pMVar27 * 4);
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar12 != pMVar27);
                        }
                        uVar22 = uVar22 + 1;
                        pMVar33 = (Mat *)((long)pMVar33 + (long)pMVar20 * 4);
                      } while (uVar22 != uVar9);
                    }
                    local_d8 = (Mat *)((long)&local_d8->data + 1);
                    local_c0 = (Mat *)((long)local_c0 + sVar2 * sVar3);
                    pvVar26 = (void *)((long)pvVar26 + (long)local_50);
                  } while (local_d8 != pMVar25);
                }
                uVar9 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar9) {
                  pMVar19 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar9 << 2);
                }
                if (0 < iVar8) {
                  pvVar26 = top_blob->data;
                  pMVar20 = (Mat *)0x0;
                  pMVar19 = (Mat *)pvVar31;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar33 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar26 + (long)pMVar33 * 4) =
                             *(float *)((long)&pMVar19->data + (long)pMVar33 * 4) +
                             *(float *)((long)pvVar26 + (long)pMVar33 * 4);
                        pMVar33 = (Mat *)((long)&pMVar33->data + 1);
                      } while (pMVar12 != pMVar33);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pMVar19 = (Mat *)((long)&pMVar19->data +
                                     (long)local_58 * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar20 != pMVar25);
                }
                iVar14 = 0;
              }
            }
          }
LAB_0013ebf7:
          Mat::~Mat((Mat *)&ptr);
          in_XMM0 = extraout_XMM0_14;
          if (iVar14 != 0) {
            return -100;
          }
        }
      }
    }
    else if (uVar10 == 2) {
      uVar10 = bottom_blob->w;
      pMVar20 = (Mat *)(ulong)uVar10;
      iVar14 = bottom_blob->h;
      lVar23 = (long)iVar14;
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      in_XMM0._0_8_ = SUB168(auVar50 ^ auVar107,0) << 0x3f;
      in_XMM0._8_8_ = SUB168(auVar50 ^ auVar107,8) << 0x3f;
      iVar8 = movmskpd(uVar13,in_XMM0);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        if (iVar14 == 0) {
          return -100;
        }
        pAVar6 = opt->workspace_allocator;
        uVar28 = sVar2 * lVar23 + 3 & 0xfffffffffffffffc;
        pMVar25 = (Mat *)(uVar28 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar19 = (Mat *)0x10;
          iVar8 = posix_memalign(&ptr,0x10,(size_t)pMVar25);
          pMVar12 = (Mat *)0x0;
          if (iVar8 == 0) {
            pMVar12 = (Mat *)ptr;
          }
        }
        else {
          pMVar12 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
          pMVar19 = pMVar25;
        }
        *(undefined4 *)((long)&pMVar12->data + uVar28) = 1;
        if (iVar14 < 1) {
          in_XMM0 = ZEXT816(0);
        }
        else {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          lVar17 = 0;
          do {
            fVar34 = 0.0;
            if (0 < (int)uVar10) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar35 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                fVar34 = fVar34 + fVar35;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar20 != pMVar25);
            }
            *(float *)((long)&pMVar12->data + lVar17 * 4) = fVar34;
            lVar17 = lVar17 + 1;
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (lVar17 != lVar23);
          in_XMM0 = ZEXT816(0);
          lVar17 = 0;
          do {
            in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)&pMVar12->data + lVar17 * 4);
            lVar17 = lVar17 + 1;
          } while (lVar23 != lVar17);
        }
        *(int *)top_blob->data = in_XMM0._0_4_;
        LOCK();
        piVar11 = (int *)((long)&pMVar12->data + uVar28);
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar6 == (Allocator *)0x0) goto LAB_0013d3b9;
          in_XMM0._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))();
          in_XMM0._8_8_ = extraout_XMM0_Qb;
          pMVar19 = pMVar12;
        }
      }
      else if (((bVar15 | (byte)iVar8 >> 1) & 1) == 0) {
        pMVar19 = (Mat *)0x1;
        Mat::create(top_blob,1,iVar14,sVar2,opt->blob_allocator);
        in_XMM0 = extraout_XMM0_07;
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          lVar17 = 0;
          do {
            in_XMM0 = ZEXT816(0);
            if (0 < (int)uVar10) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar20 != pMVar25);
            }
            *(int *)((long)pvVar26 + lVar17 * 4) = in_XMM0._0_4_;
            lVar17 = lVar17 + 1;
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (lVar17 != lVar23);
        }
      }
      else if (((bVar16 | (byte)iVar8) & 1) == 0) {
        pMVar19 = pMVar20;
        Mat::create(top_blob,uVar10,1,sVar2,opt->blob_allocator);
        uVar9 = top_blob->c * (int)top_blob->cstep;
        in_XMM0 = extraout_XMM0;
        if (0 < (int)uVar9) {
          pMVar19 = (Mat *)0x0;
          memset(top_blob->data,0,(ulong)uVar9 << 2);
          in_XMM0 = extraout_XMM0_00;
        }
        if (0 < iVar14) {
          pvVar31 = bottom_blob->data;
          iVar14 = bottom_blob->w;
          pvVar26 = top_blob->data;
          sVar2 = bottom_blob->elemsize;
          lVar17 = 0;
          do {
            if (0 < (int)uVar10) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar34 = expf(*(float *)((long)pvVar31 + (long)pMVar25 * 4));
                in_XMM0._0_4_ = fVar34 + *(float *)((long)pvVar26 + (long)pMVar25 * 4);
                in_XMM0._4_12_ = extraout_var;
                *(float *)((long)pvVar26 + (long)pMVar25 * 4) = in_XMM0._0_4_;
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar20 != pMVar25);
            }
            lVar17 = lVar17 + 1;
            pvVar31 = (void *)((long)pvVar31 + (long)iVar14 * sVar2);
          } while (lVar17 != lVar23);
        }
      }
    }
    else if (uVar10 == 1) {
      iVar14 = bottom_blob->w;
      pMVar19 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar14 < 1) {
LAB_001398b6:
        in_XMM0 = (undefined1  [16])0x0;
      }
      else {
        pvVar31 = bottom_blob->data;
        in_XMM0 = (undefined1  [16])0x0;
        lVar23 = 0;
        do {
          fVar34 = expf(*(float *)((long)pvVar31 + lVar23 * 4));
          in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar34));
          lVar23 = lVar23 + 1;
        } while (iVar14 != lVar23);
      }
LAB_001398ba:
      *(int *)top_blob->data = in_XMM0._0_4_;
    }
LAB_001398c6:
    fVar34 = in_XMM0._0_4_;
LAB_001398cb:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar34,(Option *)pMVar19);
  default:
    goto switchD_001372b2_default;
  }
  if (1.1920929e-07 < ABS(fVar34 + -1.0)) {
LAB_001398af:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar34,(Option *)pMVar19);
  }
switchD_001372b2_default:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i=0; i<reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction< reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction< reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction< std::multiplies<float>, std::multiplies<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);
    
    if (operation == ReductionOp_L1)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSum)
        return reduction< std::plus<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSumExp)
        return reduction< reduction_op_sumsexp<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}